

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_sqrt(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [16];
  undefined1 auVar1172 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1192 [16];
  undefined1 auVar1193 [16];
  undefined1 auVar1194 [16];
  undefined1 auVar1195 [16];
  undefined1 auVar1196 [16];
  undefined1 auVar1197 [16];
  undefined1 auVar1198 [16];
  undefined1 auVar1199 [16];
  undefined1 auVar1200 [16];
  undefined1 auVar1201 [16];
  undefined1 auVar1202 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1206 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1209 [16];
  undefined1 auVar1210 [16];
  undefined1 auVar1211 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1215 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1252 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1259 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1264 [16];
  undefined1 auVar1265 [16];
  undefined1 auVar1266 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1272 [16];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1278 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1282 [16];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1287 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1289 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1298 [16];
  undefined1 auVar1299 [16];
  undefined1 auVar1300 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1302 [16];
  undefined1 auVar1303 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1308 [16];
  undefined1 auVar1309 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1314 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1318 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1321 [16];
  undefined1 auVar1322 [16];
  undefined1 auVar1323 [16];
  undefined1 auVar1324 [16];
  undefined1 auVar1325 [16];
  undefined1 auVar1326 [16];
  undefined1 auVar1327 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1347 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1350 [16];
  undefined1 auVar1351 [16];
  undefined1 auVar1352 [16];
  undefined1 auVar1353 [16];
  undefined1 auVar1354 [16];
  undefined1 auVar1355 [16];
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1367 [16];
  undefined1 auVar1368 [16];
  undefined1 auVar1369 [16];
  undefined1 auVar1370 [16];
  undefined1 auVar1371 [16];
  undefined1 auVar1372 [16];
  undefined1 auVar1373 [16];
  undefined1 auVar1374 [16];
  undefined1 auVar1375 [16];
  undefined1 auVar1376 [16];
  undefined1 auVar1377 [16];
  undefined1 auVar1378 [16];
  undefined1 auVar1379 [16];
  undefined1 auVar1380 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1410 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1417 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1419 [16];
  undefined1 auVar1420 [16];
  undefined1 auVar1421 [16];
  undefined1 auVar1422 [16];
  undefined1 auVar1423 [16];
  undefined1 auVar1424 [16];
  undefined1 auVar1425 [16];
  undefined1 auVar1426 [16];
  undefined1 auVar1427 [16];
  undefined1 auVar1428 [16];
  undefined1 auVar1429 [16];
  bool bVar1430;
  undefined1 auVar1431 [16];
  undefined1 auVar1432 [16];
  undefined1 auVar1433 [16];
  undefined1 auVar1434 [16];
  undefined1 auVar1435 [16];
  undefined1 auVar1436 [16];
  undefined1 auVar1437 [16];
  undefined1 auVar1438 [16];
  undefined1 auVar1439 [16];
  undefined1 auVar1440 [16];
  undefined1 auVar1441 [16];
  undefined1 auVar1442 [16];
  undefined1 auVar1443 [16];
  undefined1 auVar1444 [16];
  undefined1 auVar1445 [16];
  undefined1 auVar1446 [16];
  undefined1 auVar1447 [16];
  undefined1 auVar1448 [16];
  undefined1 auVar1449 [16];
  undefined1 auVar1450 [16];
  undefined1 auVar1451 [16];
  undefined1 auVar1452 [16];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  bool bVar1461;
  int iVar1462;
  ulong uVar1463;
  ulong uVar1464;
  ulong uVar1465;
  ulong uVar1466;
  ulong uVar1467;
  uint64_t a4_4;
  ulong uVar1468;
  ulong uVar1469;
  ulong uVar1470;
  ulong uVar1471;
  ulong uVar1472;
  ulong uVar1473;
  ulong uVar1474;
  ulong uVar1475;
  ulong uVar1476;
  uint64_t a4;
  ulong uVar1477;
  ulong uVar1478;
  ulong uVar1479;
  ulong uVar1480;
  ulong uVar1481;
  uint64_t a4_1;
  ulong uVar1482;
  uint64_t a4_2;
  ulong uVar1483;
  ulong uVar1484;
  ulong uVar1485;
  ulong uVar1486;
  ulong uVar1487;
  ulong uVar1488;
  ulong uVar1489;
  ulong uVar1490;
  ulong uVar1491;
  ulong uVar1492;
  ulong uVar1493;
  ulong uVar1494;
  ulong uVar1495;
  ulong local_190;
  undefined4 local_180;
  undefined4 uStack_17c;
  ulong local_170;
  secp256k1_fe local_58;
  
  uVar1 = a->n[0];
  uVar2 = a->n[1];
  uVar3 = a->n[3];
  uVar1463 = uVar1 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar745._8_8_ = 0;
  auVar745._0_8_ = uVar1463;
  uVar4 = a->n[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar4;
  auVar746._8_8_ = 0;
  auVar746._0_8_ = uVar2 * 2;
  uVar5 = a->n[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar5;
  auVar747._8_8_ = 0;
  auVar747._0_8_ = uVar5;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar8 * auVar747,0);
  auVar6 = auVar9 * ZEXT816(0x1000003d10) + auVar7 * auVar746 + auVar6 * auVar745;
  uVar1471 = uVar5 * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1471;
  auVar748._8_8_ = 0;
  auVar748._0_8_ = uVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar749._8_8_ = 0;
  auVar749._0_8_ = uVar2 * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar750._8_8_ = 0;
  auVar750._0_8_ = uVar4;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SUB168(auVar8 * auVar747,8);
  auVar9 = auVar13 * ZEXT816(0x1000003d10000) +
           auVar10 * auVar748 + auVar12 * auVar750 + auVar11 * auVar749 + (auVar6 >> 0x34);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar751._8_8_ = 0;
  auVar751._0_8_ = uVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1471;
  auVar752._8_8_ = 0;
  auVar752._0_8_ = uVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar3;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = uVar4 * 2;
  auVar7 = auVar16 * auVar753 + auVar15 * auVar752 + (auVar9 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
  auVar8 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar751;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar2;
  auVar754._8_8_ = 0;
  auVar754._0_8_ = uVar1463;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1471;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = uVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  auVar756._8_8_ = 0;
  auVar756._0_8_ = uVar3;
  auVar7 = auVar20 * auVar756 + auVar19 * auVar755 + (auVar7 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar10 = (auVar8 >> 0x34) + auVar18 * auVar754 + auVar21 * ZEXT816(0x1000003d10);
  uVar1477 = auVar10._0_8_;
  uVar1482 = auVar10._8_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar4;
  auVar757._8_8_ = 0;
  auVar757._0_8_ = uVar1463;
  auVar1337._8_8_ = uVar1482 >> 0x34;
  auVar1337._0_8_ = uVar1482 * 0x1000 | uVar1477 >> 0x34;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar2;
  auVar758._8_8_ = 0;
  auVar758._0_8_ = uVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar1471;
  auVar759._8_8_ = 0;
  auVar759._0_8_ = uVar3;
  auVar7 = auVar24 * auVar759 + (auVar7 >> 0x34);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar7._0_8_;
  auVar1337 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar758 + auVar22 * auVar757 + auVar1337;
  auVar10 = auVar1337 >> 0x34;
  auVar1339._8_8_ = 0;
  auVar1339._0_8_ = auVar10._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar7._8_8_;
  auVar1338._8_8_ = auVar10._8_8_;
  auVar1338._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar1339 = auVar26 * ZEXT816(0x1000003d10000) + auVar1338 + auVar1339;
  uVar1489 = auVar1339._0_8_;
  uVar1463 = auVar8._0_8_ & 0xfffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1463;
  auVar760._8_8_ = 0;
  auVar760._0_8_ = uVar3;
  uVar1482 = (auVar1339._8_8_ << 0xc | uVar1489 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar1477;
  auVar761._8_8_ = 0;
  auVar761._0_8_ = uVar4;
  uVar1471 = auVar1337._0_8_ & 0xfffffffffffff;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar1471;
  auVar762._8_8_ = 0;
  auVar762._0_8_ = uVar2;
  uVar1489 = uVar1489 & 0xfffffffffffff;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1489;
  auVar763._8_8_ = 0;
  auVar763._0_8_ = uVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1482;
  auVar764._8_8_ = 0;
  auVar764._0_8_ = uVar5;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SUB168(auVar31 * auVar764,0);
  auVar9 = auVar28 * auVar761 + auVar27 * auVar760 + auVar29 * auVar762 + auVar30 * auVar763 +
           auVar32 * ZEXT816(0x1000003d10);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar1463;
  auVar765._8_8_ = 0;
  auVar765._0_8_ = uVar5;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar1477;
  auVar766._8_8_ = 0;
  auVar766._0_8_ = uVar3;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1471;
  auVar767._8_8_ = 0;
  auVar767._0_8_ = uVar4;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar1489;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = uVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar1482;
  auVar769._8_8_ = 0;
  auVar769._0_8_ = uVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SUB168(auVar31 * auVar764,8);
  auVar6 = auVar38 * ZEXT816(0x1000003d10000) +
           auVar37 * auVar769 +
           auVar36 * auVar768 + auVar35 * auVar767 + auVar33 * auVar765 + auVar34 * auVar766 +
           (auVar9 >> 0x34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar1463;
  auVar770._8_8_ = 0;
  auVar770._0_8_ = uVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar1477;
  auVar771._8_8_ = 0;
  auVar771._0_8_ = uVar5;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar1471;
  auVar772._8_8_ = 0;
  auVar772._0_8_ = uVar3;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar1489;
  auVar773._8_8_ = 0;
  auVar773._0_8_ = uVar4;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar1482;
  auVar774._8_8_ = 0;
  auVar774._0_8_ = uVar2;
  auVar7 = auVar43 * auVar774 + auVar42 * auVar773 + auVar41 * auVar772 + auVar40 * auVar771 +
           (auVar6 >> 0x34);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar39 * auVar770 + auVar44 * ZEXT816(0x1000003d1);
  uVar1464 = auVar8._0_8_;
  uVar1484 = auVar8._8_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar1463;
  auVar775._8_8_ = 0;
  auVar775._0_8_ = uVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar1477;
  auVar776._8_8_ = 0;
  auVar776._0_8_ = uVar1;
  auVar1310._8_8_ = uVar1484 >> 0x34;
  auVar1310._0_8_ = uVar1484 * 0x1000 | uVar1464 >> 0x34;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar1471;
  auVar777._8_8_ = 0;
  auVar777._0_8_ = uVar5;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar1489;
  auVar778._8_8_ = 0;
  auVar778._0_8_ = uVar3;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar1482;
  auVar779._8_8_ = 0;
  auVar779._0_8_ = uVar4;
  auVar7 = auVar49 * auVar779 + auVar48 * auVar778 + auVar47 * auVar777 + (auVar7 >> 0x34);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar1310 = auVar50 * ZEXT816(0x1000003d10) + auVar45 * auVar775 + auVar46 * auVar776 + auVar1310;
  uVar1484 = auVar1310._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar1463;
  auVar780._8_8_ = 0;
  auVar780._0_8_ = uVar4;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar1477;
  auVar781._8_8_ = 0;
  auVar781._0_8_ = uVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar1471;
  auVar782._8_8_ = 0;
  auVar782._0_8_ = uVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar1489;
  auVar783._8_8_ = 0;
  auVar783._0_8_ = uVar5;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar1482;
  auVar784._8_8_ = 0;
  auVar784._0_8_ = uVar3;
  auVar7 = auVar55 * auVar784 + auVar54 * auVar783 + (auVar7 >> 0x34);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar7._0_8_;
  auVar8 = auVar56 * ZEXT816(0x1000003d10) +
           auVar53 * auVar782 + auVar51 * auVar780 + auVar52 * auVar781 + (auVar1310 >> 0x34);
  uVar1477 = auVar8._0_8_;
  auVar8 = auVar8 >> 0x34;
  auVar1341._8_8_ = 0;
  auVar1341._0_8_ = auVar8._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar7._8_8_;
  auVar1340._8_8_ = auVar8._8_8_;
  auVar1340._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
  auVar1341 = auVar57 * ZEXT816(0x1000003d10000) + auVar1340 + auVar1341;
  uVar1463 = auVar1341._0_8_;
  uVar1482 = uVar1464 * 2 & 0x1ffffffffffffe;
  uVar1485 = uVar1463 & 0xfffffffffffff;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar1485;
  auVar785._8_8_ = 0;
  auVar785._0_8_ = uVar1482;
  uVar1468 = (auVar1341._8_8_ << 0xc | uVar1463 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  uVar1489 = uVar1484 * 2 & 0x1ffffffffffffe;
  uVar1472 = uVar1477 & 0xfffffffffffff;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar1472;
  auVar786._8_8_ = 0;
  auVar786._0_8_ = uVar1489;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar1468;
  auVar787._8_8_ = 0;
  auVar787._0_8_ = uVar1468;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = SUB168(auVar60 * auVar787,0);
  auVar6 = auVar61 * ZEXT816(0x1000003d10) + auVar59 * auVar786 + auVar58 * auVar785;
  uVar1471 = auVar6._0_8_;
  auVar1342._8_8_ = 0;
  auVar1342._0_8_ = auVar6._8_8_ << 0xc | uVar1471 >> 0x34;
  uVar1464 = uVar1464 & 0xfffffffffffff;
  uVar1463 = uVar1468 * 2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar1464;
  auVar788._8_8_ = 0;
  auVar788._0_8_ = uVar1463;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar1485;
  auVar789._8_8_ = 0;
  auVar789._0_8_ = uVar1489;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar1472;
  auVar790._8_8_ = 0;
  auVar790._0_8_ = uVar1472;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = SUB168(auVar60 * auVar787,8);
  auVar1342 = auVar65 * ZEXT816(0x1000003d10000) +
              auVar62 * auVar788 + auVar64 * auVar790 + auVar63 * auVar789 + auVar1342;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar1464;
  auVar791._8_8_ = 0;
  auVar791._0_8_ = uVar1464;
  uVar1484 = uVar1484 & 0xfffffffffffff;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar1484;
  auVar792._8_8_ = 0;
  auVar792._0_8_ = uVar1463;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar1485;
  auVar793._8_8_ = 0;
  auVar793._0_8_ = uVar1477 * 2 & 0x1ffffffffffffe;
  auVar6 = auVar68 * auVar793 + auVar67 * auVar792 + (auVar1342 >> 0x34);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1342._6_2_ & 0xf);
  auVar7 = auVar66 * auVar791 + auVar69 * ZEXT816(0x1000003d1);
  uVar1477 = auVar7._0_8_;
  auVar1343._8_8_ = 0;
  auVar1343._0_8_ = auVar7._8_8_ * 0x1000 | uVar1477 >> 0x34;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar1484;
  auVar794._8_8_ = 0;
  auVar794._0_8_ = uVar1482;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar1472;
  auVar795._8_8_ = 0;
  auVar795._0_8_ = uVar1463;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar1485;
  auVar796._8_8_ = 0;
  auVar796._0_8_ = uVar1485;
  auVar6 = auVar72 * auVar796 + auVar71 * auVar795 + (auVar6 >> 0x34);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar1343 = auVar73 * ZEXT816(0x1000003d10) + auVar70 * auVar794 + auVar1343;
  uVar1478 = auVar1343._0_8_;
  auVar1344._8_8_ = 0;
  auVar1344._0_8_ = auVar1343._8_8_ << 0xc | uVar1478 >> 0x34;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar1472;
  auVar797._8_8_ = 0;
  auVar797._0_8_ = uVar1482;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar1484;
  auVar798._8_8_ = 0;
  auVar798._0_8_ = uVar1484;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar1485;
  auVar799._8_8_ = 0;
  auVar799._0_8_ = uVar1463;
  auVar6 = auVar76 * auVar799 + (auVar6 >> 0x34);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = auVar6._0_8_;
  auVar1344 = auVar77 * ZEXT816(0x1000003d10) + auVar75 * auVar798 + auVar74 * auVar797 + auVar1344;
  uVar1463 = auVar1344._0_8_;
  auVar1346._8_8_ = 0;
  auVar1346._0_8_ = auVar1344._8_8_ << 0xc | uVar1463 >> 0x34;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = auVar6._8_8_;
  auVar1345._8_8_ = 0;
  auVar1345._0_8_ = uVar1471 & 0xffffffffffffe;
  auVar1346 = auVar78 * ZEXT816(0x1000003d10000) + auVar1345 + auVar1346;
  uVar1482 = auVar1346._0_8_;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar1477;
  auVar800._8_8_ = 0;
  auVar800._0_8_ = uVar3;
  uVar1471 = (auVar1342._0_8_ & 0xffffffffffff) + (auVar1346._8_8_ << 0xc | uVar1482 >> 0x34);
  uVar1478 = uVar1478 & 0xfffffffffffff;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar1478;
  auVar801._8_8_ = 0;
  auVar801._0_8_ = uVar4;
  uVar1463 = uVar1463 & 0xfffffffffffff;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar1463;
  auVar802._8_8_ = 0;
  auVar802._0_8_ = uVar2;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar1482;
  auVar803._8_8_ = 0;
  auVar803._0_8_ = uVar1;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar1471;
  auVar804._8_8_ = 0;
  auVar804._0_8_ = uVar5;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = SUB168(auVar83 * auVar804,0);
  auVar9 = auVar80 * auVar801 + auVar79 * auVar800 + auVar81 * auVar802 + auVar82 * auVar803 +
           auVar84 * ZEXT816(0x1000003d10);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar1477;
  auVar805._8_8_ = 0;
  auVar805._0_8_ = uVar5;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar1478;
  auVar806._8_8_ = 0;
  auVar806._0_8_ = uVar3;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar1463;
  auVar807._8_8_ = 0;
  auVar807._0_8_ = uVar4;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar1482;
  auVar808._8_8_ = 0;
  auVar808._0_8_ = uVar2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar1471;
  auVar809._8_8_ = 0;
  auVar809._0_8_ = uVar1;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = SUB168(auVar83 * auVar804,8);
  auVar6 = auVar90 * ZEXT816(0x1000003d10000) +
           auVar89 * auVar809 +
           auVar88 * auVar808 + auVar87 * auVar807 + auVar85 * auVar805 + auVar86 * auVar806 +
           (auVar9 >> 0x34);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar1477;
  auVar810._8_8_ = 0;
  auVar810._0_8_ = uVar1;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar1478;
  auVar811._8_8_ = 0;
  auVar811._0_8_ = uVar5;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar1463;
  auVar812._8_8_ = 0;
  auVar812._0_8_ = uVar3;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar1482;
  auVar813._8_8_ = 0;
  auVar813._0_8_ = uVar4;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar1471;
  auVar814._8_8_ = 0;
  auVar814._0_8_ = uVar2;
  auVar7 = auVar95 * auVar814 + auVar94 * auVar813 + auVar93 * auVar812 + auVar92 * auVar811 +
           (auVar6 >> 0x34);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar8 = auVar91 * auVar810 + auVar96 * ZEXT816(0x1000003d1);
  uVar1489 = auVar8._0_8_;
  uVar1486 = auVar8._8_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar1477;
  auVar815._8_8_ = 0;
  auVar815._0_8_ = uVar2;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar1478;
  auVar816._8_8_ = 0;
  auVar816._0_8_ = uVar1;
  auVar1311._8_8_ = uVar1486 >> 0x34;
  auVar1311._0_8_ = uVar1486 * 0x1000 | uVar1489 >> 0x34;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar1463;
  auVar817._8_8_ = 0;
  auVar817._0_8_ = uVar5;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar1482;
  auVar818._8_8_ = 0;
  auVar818._0_8_ = uVar3;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar1471;
  auVar819._8_8_ = 0;
  auVar819._0_8_ = uVar4;
  auVar7 = auVar101 * auVar819 + auVar100 * auVar818 + auVar99 * auVar817 + (auVar7 >> 0x34);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar1311 = auVar102 * ZEXT816(0x1000003d10) + auVar97 * auVar815 + auVar98 * auVar816 + auVar1311
  ;
  uVar1479 = auVar1311._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar1477;
  auVar820._8_8_ = 0;
  auVar820._0_8_ = uVar4;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar1478;
  auVar821._8_8_ = 0;
  auVar821._0_8_ = uVar2;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar1463;
  auVar822._8_8_ = 0;
  auVar822._0_8_ = uVar1;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar1482;
  auVar823._8_8_ = 0;
  auVar823._0_8_ = uVar5;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar1471;
  auVar824._8_8_ = 0;
  auVar824._0_8_ = uVar3;
  auVar7 = auVar107 * auVar824 + auVar106 * auVar823 + (auVar7 >> 0x34);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar7._0_8_;
  auVar8 = auVar108 * ZEXT816(0x1000003d10) +
           auVar105 * auVar822 + auVar104 * auVar821 + auVar103 * auVar820 + (auVar1311 >> 0x34);
  uVar1487 = auVar8._0_8_;
  auVar8 = auVar8 >> 0x34;
  auVar1348._8_8_ = 0;
  auVar1348._0_8_ = auVar8._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar7._8_8_;
  auVar1347._8_8_ = auVar8._8_8_;
  auVar1347._0_8_ = auVar9._0_8_ & 0xfffffffffffff;
  auVar1348 = auVar109 * ZEXT816(0x1000003d10000) + auVar1347 + auVar1348;
  uVar1486 = auVar1348._0_8_;
  uVar1478 = (auVar1348._8_8_ << 0xc | uVar1486 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
  iVar1462 = 3;
  uVar1471 = uVar1479;
  uVar1477 = uVar1487;
  uVar1463 = uVar1478;
  uVar1482 = uVar1486;
  local_190 = uVar1489;
  do {
    uVar1482 = uVar1482 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1469 = uVar1471 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1465 = local_190 * 2;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar1465;
    auVar825._8_8_ = 0;
    auVar825._0_8_ = uVar1482;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar1469 * 2;
    auVar826._8_8_ = 0;
    auVar826._0_8_ = uVar1477;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar1463;
    auVar827._8_8_ = 0;
    auVar827._0_8_ = uVar1463;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = SUB168(auVar112 * auVar827,0);
    auVar8 = auVar110 * auVar825 + auVar113 * ZEXT816(0x1000003d10) + auVar111 * auVar826;
    uVar1463 = uVar1463 * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_190;
    auVar828._8_8_ = 0;
    auVar828._0_8_ = uVar1463;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar1469 * 2;
    auVar829._8_8_ = 0;
    auVar829._0_8_ = uVar1482;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar1477;
    auVar830._8_8_ = 0;
    auVar830._0_8_ = uVar1477;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = SUB168(auVar112 * auVar827,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar115 * auVar829 + auVar117 * ZEXT816(0x1000003d10000) + auVar116 * auVar830 +
             auVar114 * auVar828;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_190;
    auVar831._8_8_ = 0;
    auVar831._0_8_ = local_190;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar1469;
    auVar832._8_8_ = 0;
    auVar832._0_8_ = uVar1463;
    auVar1312._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1312._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar1477 * 2;
    auVar833._8_8_ = 0;
    auVar833._0_8_ = uVar1482;
    auVar1312 = auVar120 * auVar833 + auVar119 * auVar832 + auVar1312;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = (auVar1312._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar121 * ZEXT816(0x1000003d1) + auVar118 * auVar831;
    local_190 = auVar6._0_8_;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar1465;
    auVar834._8_8_ = 0;
    auVar834._0_8_ = uVar1469;
    auVar1349._8_8_ = 0;
    auVar1349._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar1477;
    auVar835._8_8_ = 0;
    auVar835._0_8_ = uVar1463;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar1482;
    auVar836._8_8_ = 0;
    auVar836._0_8_ = uVar1482;
    auVar6 = auVar124 * auVar836 + auVar123 * auVar835 + (auVar1312 >> 0x34);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1349 = auVar125 * ZEXT816(0x1000003d10) + auVar122 * auVar834 + auVar1349;
    uVar1471 = auVar1349._0_8_;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar1465;
    auVar837._8_8_ = 0;
    auVar837._0_8_ = uVar1477;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar1469;
    auVar838._8_8_ = 0;
    auVar838._0_8_ = uVar1469;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar1482;
    auVar839._8_8_ = 0;
    auVar839._0_8_ = uVar1463;
    auVar6 = auVar128 * auVar839 + (auVar6 >> 0x34);
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auVar6._0_8_;
    auVar7 = auVar129 * ZEXT816(0x1000003d10) + auVar127 * auVar838 + auVar126 * auVar837 +
             (auVar1349 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1351._8_8_ = 0;
    auVar1351._0_8_ = auVar7._0_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auVar6._8_8_;
    auVar1350._8_8_ = auVar7._8_8_;
    auVar1350._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1351 = auVar130 * ZEXT816(0x1000003d10000) + auVar1350 + auVar1351;
    uVar1482 = auVar1351._0_8_;
    uVar1463 = (auVar1351._8_8_ << 0xc | uVar1482 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_190 = local_190 & 0xfffffffffffff;
  uVar1486 = uVar1486 & 0xfffffffffffff;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_190;
  auVar840._8_8_ = 0;
  auVar840._0_8_ = uVar1486;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  uVar1487 = uVar1487 & 0xfffffffffffff;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar1471;
  auVar841._8_8_ = 0;
  auVar841._0_8_ = uVar1487;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  uVar1479 = uVar1479 & 0xfffffffffffff;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar1477;
  auVar842._8_8_ = 0;
  auVar842._0_8_ = uVar1479;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  uVar1489 = uVar1489 & 0xfffffffffffff;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar1482;
  auVar843._8_8_ = 0;
  auVar843._0_8_ = uVar1489;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar1463;
  auVar844._8_8_ = 0;
  auVar844._0_8_ = uVar1478;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = SUB168(auVar135 * auVar844,0);
  auVar6 = auVar131 * auVar840 +
           auVar132 * auVar841 +
           auVar133 * auVar842 + auVar136 * ZEXT816(0x1000003d10) + auVar134 * auVar843;
  uVar1465 = auVar6._0_8_;
  uVar1469 = auVar6._8_8_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_190;
  auVar845._8_8_ = 0;
  auVar845._0_8_ = uVar1478;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar1471;
  auVar846._8_8_ = 0;
  auVar846._0_8_ = uVar1486;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar1477;
  auVar847._8_8_ = 0;
  auVar847._0_8_ = uVar1487;
  auVar1456._8_8_ = uVar1469 >> 0x34;
  auVar1456._0_8_ = uVar1469 * 0x1000 | uVar1465 >> 0x34;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar1482;
  auVar848._8_8_ = 0;
  auVar848._0_8_ = uVar1479;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar1489;
  auVar849._8_8_ = 0;
  auVar849._0_8_ = uVar1463;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = SUB168(auVar135 * auVar844,8);
  auVar1456 = auVar137 * auVar845 +
              auVar138 * auVar846 +
              auVar139 * auVar847 +
              auVar142 * ZEXT816(0x1000003d10000) + auVar141 * auVar849 + auVar140 * auVar848 +
              auVar1456;
  auVar1431._8_8_ = auVar1456._8_8_ >> 0x34;
  auVar1431._0_8_ = auVar1456._8_8_ * 0x1000 | auVar1456._0_8_ >> 0x34;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = local_190;
  auVar850._8_8_ = 0;
  auVar850._0_8_ = uVar1489;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar1471;
  auVar851._8_8_ = 0;
  auVar851._0_8_ = uVar1478;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar1477;
  auVar852._8_8_ = 0;
  auVar852._0_8_ = uVar1486;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar1482;
  auVar853._8_8_ = 0;
  auVar853._0_8_ = uVar1487;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar1479;
  auVar854._8_8_ = 0;
  auVar854._0_8_ = uVar1463;
  auVar1431 = auVar144 * auVar851 + auVar146 * auVar853 + auVar147 * auVar854 + auVar145 * auVar852
              + auVar1431;
  uVar1469 = auVar1431._0_8_;
  uVar1488 = auVar1431._8_8_;
  auVar1432._8_8_ = uVar1488 >> 0x34;
  auVar1432._0_8_ = uVar1488 * 0x1000 | uVar1469 >> 0x34;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar1469 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1456._6_2_ & 0xf);
  auVar6 = auVar143 * auVar850 + auVar148 * ZEXT816(0x1000003d1);
  local_170 = auVar6._0_8_;
  auVar1352._8_8_ = 0;
  auVar1352._0_8_ = auVar6._8_8_ * 0x1000 | local_170 >> 0x34;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = local_190;
  auVar855._8_8_ = 0;
  auVar855._0_8_ = uVar1479;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar1471;
  auVar856._8_8_ = 0;
  auVar856._0_8_ = uVar1489;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar1477;
  auVar857._8_8_ = 0;
  auVar857._0_8_ = uVar1478;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar1482;
  auVar858._8_8_ = 0;
  auVar858._0_8_ = uVar1486;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar1487;
  auVar859._8_8_ = 0;
  auVar859._0_8_ = uVar1463;
  auVar1432 = auVar151 * auVar857 + auVar153 * auVar859 + auVar152 * auVar858 + auVar1432;
  uVar1492 = auVar1432._0_8_;
  uVar1488 = auVar1432._8_8_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar1492 & 0xfffffffffffff;
  auVar1352 = auVar154 * ZEXT816(0x1000003d10) + auVar149 * auVar855 + auVar150 * auVar856 +
              auVar1352;
  uVar1469 = auVar1352._0_8_;
  auVar1353._8_8_ = 0;
  auVar1353._0_8_ = auVar1352._8_8_ << 0xc | uVar1469 >> 0x34;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = local_190;
  auVar860._8_8_ = 0;
  auVar860._0_8_ = uVar1487;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar1471;
  auVar861._8_8_ = 0;
  auVar861._0_8_ = uVar1479;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar1477;
  auVar862._8_8_ = 0;
  auVar862._0_8_ = uVar1489;
  auVar1313._8_8_ = uVar1488 >> 0x34;
  auVar1313._0_8_ = uVar1488 * 0x1000 | uVar1492 >> 0x34;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar1482;
  auVar863._8_8_ = 0;
  auVar863._0_8_ = uVar1478;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar1486;
  auVar864._8_8_ = 0;
  auVar864._0_8_ = uVar1463;
  auVar1313 = auVar159 * auVar864 + auVar158 * auVar863 + auVar1313;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = auVar1313._0_8_;
  auVar1353 = auVar160 * ZEXT816(0x1000003d10) +
              auVar155 * auVar860 + auVar157 * auVar862 + auVar156 * auVar861 + auVar1353;
  uVar1477 = auVar1353._0_8_;
  auVar1353 = auVar1353 >> 0x34;
  auVar1355._8_8_ = 0;
  auVar1355._0_8_ = auVar1353._0_8_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = auVar1313._8_8_;
  auVar1354._8_8_ = auVar1353._8_8_;
  auVar1354._0_8_ = uVar1465 & 0xfffffffffffff;
  auVar1355 = auVar161 * ZEXT816(0x1000003d10000) + auVar1354 + auVar1355;
  uVar1471 = auVar1355._0_8_;
  uVar1463 = (auVar1355._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar1456._0_8_ & 0xffffffffffff);
  iVar1462 = 3;
  do {
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1465 = uVar1469 & 0xfffffffffffff;
    local_170 = local_170 & 0xfffffffffffff;
    uVar1482 = local_170 * 2;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar1482;
    auVar865._8_8_ = 0;
    auVar865._0_8_ = uVar1471;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar1465 * 2;
    auVar866._8_8_ = 0;
    auVar866._0_8_ = uVar1477;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar1463;
    auVar867._8_8_ = 0;
    auVar867._0_8_ = uVar1463;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = SUB168(auVar164 * auVar867,0);
    auVar8 = auVar162 * auVar865 + auVar165 * ZEXT816(0x1000003d10) + auVar163 * auVar866;
    uVar1463 = uVar1463 * 2;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = local_170;
    auVar868._8_8_ = 0;
    auVar868._0_8_ = uVar1463;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar1465 * 2;
    auVar869._8_8_ = 0;
    auVar869._0_8_ = uVar1471;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar1477;
    auVar870._8_8_ = 0;
    auVar870._0_8_ = uVar1477;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = SUB168(auVar164 * auVar867,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar167 * auVar869 + auVar169 * ZEXT816(0x1000003d10000) + auVar168 * auVar870 +
             auVar166 * auVar868;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = local_170;
    auVar871._8_8_ = 0;
    auVar871._0_8_ = local_170;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar1465;
    auVar872._8_8_ = 0;
    auVar872._0_8_ = uVar1463;
    auVar1314._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1314._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar1477 * 2;
    auVar873._8_8_ = 0;
    auVar873._0_8_ = uVar1471;
    auVar1314 = auVar172 * auVar873 + auVar171 * auVar872 + auVar1314;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (auVar1314._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar173 * ZEXT816(0x1000003d1) + auVar170 * auVar871;
    local_170 = auVar6._0_8_;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar1482;
    auVar874._8_8_ = 0;
    auVar874._0_8_ = uVar1465;
    auVar1356._8_8_ = 0;
    auVar1356._0_8_ = auVar6._8_8_ << 0xc | local_170 >> 0x34;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar1477;
    auVar875._8_8_ = 0;
    auVar875._0_8_ = uVar1463;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar1471;
    auVar876._8_8_ = 0;
    auVar876._0_8_ = uVar1471;
    auVar6 = auVar176 * auVar876 + auVar175 * auVar875 + (auVar1314 >> 0x34);
    auVar177._8_8_ = 0;
    auVar177._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1356 = auVar177 * ZEXT816(0x1000003d10) + auVar174 * auVar874 + auVar1356;
    uVar1469 = auVar1356._0_8_;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar1482;
    auVar877._8_8_ = 0;
    auVar877._0_8_ = uVar1477;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar1465;
    auVar878._8_8_ = 0;
    auVar878._0_8_ = uVar1465;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar1471;
    auVar879._8_8_ = 0;
    auVar879._0_8_ = uVar1463;
    auVar6 = auVar180 * auVar879 + (auVar6 >> 0x34);
    auVar181._8_8_ = 0;
    auVar181._0_8_ = auVar6._0_8_;
    auVar7 = auVar181 * ZEXT816(0x1000003d10) + auVar179 * auVar878 + auVar178 * auVar877 +
             (auVar1356 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1358._8_8_ = 0;
    auVar1358._0_8_ = auVar7._0_8_;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = auVar6._8_8_;
    auVar1357._8_8_ = auVar7._8_8_;
    auVar1357._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1358 = auVar182 * ZEXT816(0x1000003d10000) + auVar1357 + auVar1358;
    uVar1471 = auVar1358._0_8_;
    uVar1463 = (auVar1358._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_170 = local_170 & 0xfffffffffffff;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_170;
  auVar880._8_8_ = 0;
  auVar880._0_8_ = uVar1486;
  uVar1469 = uVar1469 & 0xfffffffffffff;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar1469;
  auVar881._8_8_ = 0;
  auVar881._0_8_ = uVar1487;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar1477;
  auVar882._8_8_ = 0;
  auVar882._0_8_ = uVar1479;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar1471;
  auVar883._8_8_ = 0;
  auVar883._0_8_ = uVar1489;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar1463;
  auVar884._8_8_ = 0;
  auVar884._0_8_ = uVar1478;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = SUB168(auVar187 * auVar884,0);
  auVar6 = auVar183 * auVar880 +
           auVar184 * auVar881 +
           auVar186 * auVar883 + auVar188 * ZEXT816(0x1000003d10) + auVar185 * auVar882;
  uVar1482 = auVar6._0_8_;
  uVar1465 = auVar6._8_8_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_170;
  auVar885._8_8_ = 0;
  auVar885._0_8_ = uVar1478;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar1469;
  auVar886._8_8_ = 0;
  auVar886._0_8_ = uVar1486;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar1477;
  auVar887._8_8_ = 0;
  auVar887._0_8_ = uVar1487;
  auVar1433._8_8_ = uVar1465 >> 0x34;
  auVar1433._0_8_ = uVar1465 * 0x1000 | uVar1482 >> 0x34;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar1471;
  auVar888._8_8_ = 0;
  auVar888._0_8_ = uVar1479;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar1489;
  auVar889._8_8_ = 0;
  auVar889._0_8_ = uVar1463;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = SUB168(auVar187 * auVar884,8);
  auVar1433 = auVar189 * auVar885 +
              auVar190 * auVar886 +
              auVar191 * auVar887 +
              auVar194 * ZEXT816(0x1000003d10000) + auVar193 * auVar889 + auVar192 * auVar888 +
              auVar1433;
  auVar1315._8_8_ = auVar1433._8_8_ >> 0x34;
  auVar1315._0_8_ = auVar1433._8_8_ * 0x1000 | auVar1433._0_8_ >> 0x34;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = local_170;
  auVar890._8_8_ = 0;
  auVar890._0_8_ = uVar1489;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar1469;
  auVar891._8_8_ = 0;
  auVar891._0_8_ = uVar1478;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar1477;
  auVar892._8_8_ = 0;
  auVar892._0_8_ = uVar1486;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar1471;
  auVar893._8_8_ = 0;
  auVar893._0_8_ = uVar1487;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar1479;
  auVar894._8_8_ = 0;
  auVar894._0_8_ = uVar1463;
  auVar1315 = auVar199 * auVar894 + auVar198 * auVar893 + auVar197 * auVar892 + auVar196 * auVar891
              + auVar1315;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = (auVar1315._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1433._6_2_ & 0xf);
  auVar6 = auVar195 * auVar890 + auVar200 * ZEXT816(0x1000003d1);
  local_190 = auVar6._0_8_;
  auVar1359._8_8_ = 0;
  auVar1359._0_8_ = auVar6._8_8_ * 0x1000 | local_190 >> 0x34;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = local_170;
  auVar895._8_8_ = 0;
  auVar895._0_8_ = uVar1479;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar1469;
  auVar896._8_8_ = 0;
  auVar896._0_8_ = uVar1489;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar1477;
  auVar897._8_8_ = 0;
  auVar897._0_8_ = uVar1478;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar1471;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = uVar1486;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar1487;
  auVar899._8_8_ = 0;
  auVar899._0_8_ = uVar1463;
  auVar6 = (auVar1315 >> 0x34) + auVar203 * auVar897 + auVar205 * auVar899 + auVar204 * auVar898;
  uVar1492 = auVar6._0_8_;
  uVar1488 = auVar6._8_8_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar1492 & 0xfffffffffffff;
  auVar1359 = auVar206 * ZEXT816(0x1000003d10) + auVar201 * auVar895 + auVar202 * auVar896 +
              auVar1359;
  uVar1465 = auVar1359._0_8_;
  auVar1316._8_8_ = uVar1488 >> 0x34;
  auVar1316._0_8_ = uVar1488 * 0x1000 | uVar1492 >> 0x34;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = local_170;
  auVar900._8_8_ = 0;
  auVar900._0_8_ = uVar1487;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar1469;
  auVar901._8_8_ = 0;
  auVar901._0_8_ = uVar1479;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar1477;
  auVar902._8_8_ = 0;
  auVar902._0_8_ = uVar1489;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar1471;
  auVar903._8_8_ = 0;
  auVar903._0_8_ = uVar1478;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar1486;
  auVar904._8_8_ = 0;
  auVar904._0_8_ = uVar1463;
  auVar1316 = auVar211 * auVar904 + auVar210 * auVar903 + auVar1316;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = auVar1316._0_8_;
  auVar6 = auVar212 * ZEXT816(0x1000003d10) +
           auVar208 * auVar901 + auVar209 * auVar902 + auVar207 * auVar900 + (auVar1359 >> 0x34);
  uVar1477 = auVar6._0_8_;
  auVar6 = auVar6 >> 0x34;
  auVar1361._8_8_ = 0;
  auVar1361._0_8_ = auVar6._0_8_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = auVar1316._8_8_;
  auVar1360._8_8_ = auVar6._8_8_;
  auVar1360._0_8_ = uVar1482 & 0xfffffffffffff;
  auVar1361 = auVar213 * ZEXT816(0x1000003d10000) + auVar1360 + auVar1361;
  uVar1471 = auVar1361._0_8_;
  uVar1463 = (auVar1361._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar1433._0_8_ & 0xffffffffffff);
  bVar1461 = true;
  do {
    bVar1430 = bVar1461;
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1469 = uVar1465 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1482 = local_190 * 2;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar1482;
    auVar905._8_8_ = 0;
    auVar905._0_8_ = uVar1471;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar1469 * 2;
    auVar906._8_8_ = 0;
    auVar906._0_8_ = uVar1477;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar1463;
    auVar907._8_8_ = 0;
    auVar907._0_8_ = uVar1463;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = SUB168(auVar216 * auVar907,0);
    auVar8 = auVar214 * auVar905 + auVar217 * ZEXT816(0x1000003d10) + auVar215 * auVar906;
    uVar1463 = uVar1463 * 2;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = local_190;
    auVar908._8_8_ = 0;
    auVar908._0_8_ = uVar1463;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar1469 * 2;
    auVar909._8_8_ = 0;
    auVar909._0_8_ = uVar1471;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar1477;
    auVar910._8_8_ = 0;
    auVar910._0_8_ = uVar1477;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = SUB168(auVar216 * auVar907,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar219 * auVar909 + auVar221 * ZEXT816(0x1000003d10000) + auVar220 * auVar910 +
             auVar218 * auVar908;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = local_190;
    auVar911._8_8_ = 0;
    auVar911._0_8_ = local_190;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar1469;
    auVar912._8_8_ = 0;
    auVar912._0_8_ = uVar1463;
    auVar1317._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1317._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = uVar1477 * 2;
    auVar913._8_8_ = 0;
    auVar913._0_8_ = uVar1471;
    auVar1317 = auVar224 * auVar913 + auVar223 * auVar912 + auVar1317;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = (auVar1317._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar225 * ZEXT816(0x1000003d1) + auVar222 * auVar911;
    local_190 = auVar6._0_8_;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar1482;
    auVar914._8_8_ = 0;
    auVar914._0_8_ = uVar1469;
    auVar1362._8_8_ = 0;
    auVar1362._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar1477;
    auVar915._8_8_ = 0;
    auVar915._0_8_ = uVar1463;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar1471;
    auVar916._8_8_ = 0;
    auVar916._0_8_ = uVar1471;
    auVar6 = auVar228 * auVar916 + auVar227 * auVar915 + (auVar1317 >> 0x34);
    auVar229._8_8_ = 0;
    auVar229._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1362 = auVar229 * ZEXT816(0x1000003d10) + auVar226 * auVar914 + auVar1362;
    uVar1465 = auVar1362._0_8_;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar1482;
    auVar917._8_8_ = 0;
    auVar917._0_8_ = uVar1477;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar1469;
    auVar918._8_8_ = 0;
    auVar918._0_8_ = uVar1469;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar1471;
    auVar919._8_8_ = 0;
    auVar919._0_8_ = uVar1463;
    auVar6 = auVar232 * auVar919 + (auVar6 >> 0x34);
    auVar233._8_8_ = 0;
    auVar233._0_8_ = auVar6._0_8_;
    auVar7 = auVar233 * ZEXT816(0x1000003d10) + auVar231 * auVar918 + auVar230 * auVar917 +
             (auVar1362 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1364._8_8_ = 0;
    auVar1364._0_8_ = auVar7._0_8_;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = auVar6._8_8_;
    auVar1363._8_8_ = auVar7._8_8_;
    auVar1363._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1364 = auVar234 * ZEXT816(0x1000003d10000) + auVar1363 + auVar1364;
    uVar1471 = auVar1364._0_8_;
    uVar1463 = (auVar1364._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    bVar1461 = false;
  } while (bVar1430);
  local_190 = local_190 & 0xfffffffffffff;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = local_190;
  auVar920._8_8_ = 0;
  auVar920._0_8_ = uVar1485;
  uVar1465 = uVar1465 & 0xfffffffffffff;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar1465;
  auVar921._8_8_ = 0;
  auVar921._0_8_ = uVar1472;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar1477;
  auVar922._8_8_ = 0;
  auVar922._0_8_ = uVar1484;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar1471;
  auVar923._8_8_ = 0;
  auVar923._0_8_ = uVar1464;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar1463;
  auVar924._8_8_ = 0;
  auVar924._0_8_ = uVar1468;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = SUB168(auVar239 * auVar924,0);
  auVar6 = auVar235 * auVar920 +
           auVar236 * auVar921 +
           auVar238 * auVar923 + auVar240 * ZEXT816(0x1000003d10) + auVar237 * auVar922;
  uVar1482 = auVar6._0_8_;
  uVar1469 = auVar6._8_8_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = local_190;
  auVar925._8_8_ = 0;
  auVar925._0_8_ = uVar1468;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar1465;
  auVar926._8_8_ = 0;
  auVar926._0_8_ = uVar1485;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar1477;
  auVar927._8_8_ = 0;
  auVar927._0_8_ = uVar1472;
  auVar1434._8_8_ = uVar1469 >> 0x34;
  auVar1434._0_8_ = uVar1469 * 0x1000 | uVar1482 >> 0x34;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar1471;
  auVar928._8_8_ = 0;
  auVar928._0_8_ = uVar1484;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar1464;
  auVar929._8_8_ = 0;
  auVar929._0_8_ = uVar1463;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = SUB168(auVar239 * auVar924,8);
  auVar1434 = auVar241 * auVar925 +
              auVar242 * auVar926 +
              auVar243 * auVar927 +
              auVar246 * ZEXT816(0x1000003d10000) + auVar245 * auVar929 + auVar244 * auVar928 +
              auVar1434;
  auVar1435._8_8_ = auVar1434._8_8_ >> 0x34;
  auVar1435._0_8_ = auVar1434._8_8_ * 0x1000 | auVar1434._0_8_ >> 0x34;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = local_190;
  auVar930._8_8_ = 0;
  auVar930._0_8_ = uVar1464;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar1465;
  auVar931._8_8_ = 0;
  auVar931._0_8_ = uVar1468;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar1477;
  auVar932._8_8_ = 0;
  auVar932._0_8_ = uVar1485;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar1471;
  auVar933._8_8_ = 0;
  auVar933._0_8_ = uVar1472;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar1484;
  auVar934._8_8_ = 0;
  auVar934._0_8_ = uVar1463;
  auVar1435 = auVar248 * auVar931 + auVar251 * auVar934 + auVar250 * auVar933 + auVar249 * auVar932
              + auVar1435;
  uVar1469 = auVar1435._0_8_;
  uVar1488 = auVar1435._8_8_;
  auVar1365._8_8_ = uVar1488 >> 0x34;
  auVar1365._0_8_ = uVar1488 * 0x1000 | uVar1469 >> 0x34;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar1469 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1434._6_2_ & 0xf);
  auVar8 = auVar247 * auVar930 + auVar252 * ZEXT816(0x1000003d1);
  auVar1366._8_8_ = 0;
  auVar1366._0_8_ = auVar8._8_8_ * 0x1000 | auVar8._0_8_ >> 0x34;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = local_190;
  auVar935._8_8_ = 0;
  auVar935._0_8_ = uVar1484;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar1465;
  auVar936._8_8_ = 0;
  auVar936._0_8_ = uVar1464;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar1477;
  auVar937._8_8_ = 0;
  auVar937._0_8_ = uVar1468;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar1471;
  auVar938._8_8_ = 0;
  auVar938._0_8_ = uVar1485;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar1472;
  auVar939._8_8_ = 0;
  auVar939._0_8_ = uVar1463;
  auVar1365 = auVar255 * auVar937 + auVar257 * auVar939 + auVar256 * auVar938 + auVar1365;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = auVar1365._0_8_ & 0xfffffffffffff;
  auVar1366 = auVar258 * ZEXT816(0x1000003d10) + auVar253 * auVar935 + auVar254 * auVar936 +
              auVar1366;
  uVar1488 = auVar1366._0_8_;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = local_190;
  auVar940._8_8_ = 0;
  auVar940._0_8_ = uVar1472;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar1465;
  auVar941._8_8_ = 0;
  auVar941._0_8_ = uVar1484;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar1477;
  auVar942._8_8_ = 0;
  auVar942._0_8_ = uVar1464;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar1471;
  auVar943._8_8_ = 0;
  auVar943._0_8_ = uVar1468;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar1485;
  auVar944._8_8_ = 0;
  auVar944._0_8_ = uVar1463;
  auVar6 = auVar263 * auVar944 + auVar262 * auVar943 + (auVar1365 >> 0x34);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = auVar6._0_8_;
  auVar7 = auVar264 * ZEXT816(0x1000003d10) +
           auVar261 * auVar942 + auVar260 * auVar941 + auVar259 * auVar940 + (auVar1366 >> 0x34);
  uVar1469 = auVar7._0_8_;
  auVar7 = auVar7 >> 0x34;
  auVar1368._8_8_ = 0;
  auVar1368._0_8_ = auVar7._0_8_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = auVar6._8_8_;
  auVar1367._8_8_ = auVar7._8_8_;
  auVar1367._0_8_ = uVar1482 & 0xfffffffffffff;
  auVar1368 = auVar265 * ZEXT816(0x1000003d10000) + auVar1367 + auVar1368;
  uVar1465 = auVar1368._0_8_;
  uVar1492 = (auVar1368._8_8_ << 0xc | uVar1465 >> 0x34) + (auVar1434._0_8_ & 0xffffffffffff);
  iVar1462 = 0xb;
  local_180 = auVar8._0_4_;
  uStack_17c = auVar8._4_4_;
  uVar1471 = uVar1465;
  uVar1477 = uVar1469;
  uVar1463 = uVar1492;
  uVar1482 = uVar1488;
  do {
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1495 = uVar1482 & 0xfffffffffffff;
    uVar1482 = CONCAT44(uStack_17c,local_180) & 0xfffffffffffff;
    uVar1466 = uVar1482 * 2;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = uVar1466;
    auVar945._8_8_ = 0;
    auVar945._0_8_ = uVar1471;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = uVar1495 * 2;
    auVar946._8_8_ = 0;
    auVar946._0_8_ = uVar1477;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uVar1463;
    auVar947._8_8_ = 0;
    auVar947._0_8_ = uVar1463;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = SUB168(auVar268 * auVar947,0);
    auVar7 = auVar266 * auVar945 + auVar269 * ZEXT816(0x1000003d10) + auVar267 * auVar946;
    uVar1463 = uVar1463 * 2;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar1482;
    auVar948._8_8_ = 0;
    auVar948._0_8_ = uVar1463;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = uVar1495 * 2;
    auVar949._8_8_ = 0;
    auVar949._0_8_ = uVar1471;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = uVar1477;
    auVar950._8_8_ = 0;
    auVar950._0_8_ = uVar1477;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = SUB168(auVar268 * auVar947,8);
    auVar10 = (auVar7 >> 0x34) +
              auVar272 * auVar950 + auVar273 * ZEXT816(0x1000003d10000) + auVar271 * auVar949 +
              auVar270 * auVar948;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = uVar1482;
    auVar951._8_8_ = 0;
    auVar951._0_8_ = uVar1482;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = uVar1495;
    auVar952._8_8_ = 0;
    auVar952._0_8_ = uVar1463;
    auVar1318._8_8_ = auVar10._8_8_ >> 0x34;
    auVar1318._0_8_ = auVar10._8_8_ * 0x1000 | auVar10._0_8_ >> 0x34;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uVar1477 * 2;
    auVar953._8_8_ = 0;
    auVar953._0_8_ = uVar1471;
    auVar1318 = auVar276 * auVar953 + auVar275 * auVar952 + auVar1318;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = (auVar1318._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar10._6_2_ & 0xf);
    auVar9 = auVar277 * ZEXT816(0x1000003d1) + auVar274 * auVar951;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = uVar1466;
    auVar954._8_8_ = 0;
    auVar954._0_8_ = uVar1495;
    local_180 = auVar9._0_4_;
    uStack_17c = auVar9._4_4_;
    auVar1436._8_8_ = 0;
    auVar1436._0_8_ = auVar9._8_8_ << 0xc | auVar9._0_8_ >> 0x34;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = uVar1477;
    auVar955._8_8_ = 0;
    auVar955._0_8_ = uVar1463;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = uVar1471;
    auVar956._8_8_ = 0;
    auVar956._0_8_ = uVar1471;
    auVar6 = auVar280 * auVar956 + auVar279 * auVar955 + (auVar1318 >> 0x34);
    auVar281._8_8_ = 0;
    auVar281._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1436 = auVar278 * auVar954 + auVar281 * ZEXT816(0x1000003d10) + auVar1436;
    uVar1482 = auVar1436._0_8_;
    uVar1473 = auVar1436._8_8_;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = uVar1466;
    auVar957._8_8_ = 0;
    auVar957._0_8_ = uVar1477;
    auVar1319._8_8_ = uVar1473 >> 0x34;
    auVar1319._0_8_ = uVar1473 * 0x1000 | uVar1482 >> 0x34;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = uVar1495;
    auVar958._8_8_ = 0;
    auVar958._0_8_ = uVar1495;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = uVar1471;
    auVar959._8_8_ = 0;
    auVar959._0_8_ = uVar1463;
    auVar6 = auVar284 * auVar959 + (auVar6 >> 0x34);
    auVar285._8_8_ = 0;
    auVar285._0_8_ = auVar6._0_8_;
    auVar1319 = auVar285 * ZEXT816(0x1000003d10) + auVar283 * auVar958 + auVar282 * auVar957 +
                auVar1319;
    uVar1477 = auVar1319._0_8_;
    auVar1319 = auVar1319 >> 0x34;
    auVar1370._8_8_ = 0;
    auVar1370._0_8_ = auVar1319._0_8_;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = auVar6._8_8_;
    auVar1369._8_8_ = auVar1319._8_8_;
    auVar1369._0_8_ = auVar7._0_8_ & 0xffffffffffffe;
    auVar1370 = auVar286 * ZEXT816(0x1000003d10000) + auVar1369 + auVar1370;
    uVar1471 = auVar1370._0_8_;
    uVar1463 = (auVar1370._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar10._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  uVar1493 = auVar9._0_8_ & 0xfffffffffffff;
  uVar1465 = uVar1465 & 0xfffffffffffff;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar1493;
  auVar960._8_8_ = 0;
  auVar960._0_8_ = uVar1465;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  uVar1469 = uVar1469 & 0xfffffffffffff;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar1482;
  auVar961._8_8_ = 0;
  auVar961._0_8_ = uVar1469;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  uVar1488 = uVar1488 & 0xfffffffffffff;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar1477;
  auVar962._8_8_ = 0;
  auVar962._0_8_ = uVar1488;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  uVar1495 = auVar8._0_8_ & 0xfffffffffffff;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar1471;
  auVar963._8_8_ = 0;
  auVar963._0_8_ = uVar1495;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar1463;
  auVar964._8_8_ = 0;
  auVar964._0_8_ = uVar1492;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = SUB168(auVar291 * auVar964,0);
  auVar6 = auVar288 * auVar961 +
           auVar289 * auVar962 + auVar292 * ZEXT816(0x1000003d10) + auVar290 * auVar963 +
           auVar287 * auVar960;
  uVar1466 = auVar6._0_8_;
  uVar1473 = auVar6._8_8_;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar1493;
  auVar965._8_8_ = 0;
  auVar965._0_8_ = uVar1492;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar1482;
  auVar966._8_8_ = 0;
  auVar966._0_8_ = uVar1465;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar1477;
  auVar967._8_8_ = 0;
  auVar967._0_8_ = uVar1469;
  auVar1457._8_8_ = uVar1473 >> 0x34;
  auVar1457._0_8_ = uVar1473 * 0x1000 | uVar1466 >> 0x34;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar1471;
  auVar968._8_8_ = 0;
  auVar968._0_8_ = uVar1488;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar1495;
  auVar969._8_8_ = 0;
  auVar969._0_8_ = uVar1463;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = SUB168(auVar291 * auVar964,8);
  auVar1457 = auVar293 * auVar965 +
              auVar294 * auVar966 +
              auVar298 * ZEXT816(0x1000003d10000) + auVar296 * auVar968 + auVar297 * auVar969 +
              auVar295 * auVar967 + auVar1457;
  auVar1437._8_8_ = auVar1457._8_8_ >> 0x34;
  auVar1437._0_8_ = auVar1457._8_8_ * 0x1000 | auVar1457._0_8_ >> 0x34;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar1493;
  auVar970._8_8_ = 0;
  auVar970._0_8_ = uVar1495;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar1482;
  auVar971._8_8_ = 0;
  auVar971._0_8_ = uVar1492;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar1477;
  auVar972._8_8_ = 0;
  auVar972._0_8_ = uVar1465;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar1471;
  auVar973._8_8_ = 0;
  auVar973._0_8_ = uVar1469;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar1488;
  auVar974._8_8_ = 0;
  auVar974._0_8_ = uVar1463;
  auVar1437 = auVar300 * auVar971 + auVar303 * auVar974 + auVar302 * auVar973 + auVar301 * auVar972
              + auVar1437;
  uVar1473 = auVar1437._0_8_;
  uVar1490 = auVar1437._8_8_;
  auVar1438._8_8_ = uVar1490 >> 0x34;
  auVar1438._0_8_ = uVar1490 * 0x1000 | uVar1473 >> 0x34;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar1473 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1457._6_2_ & 0xf);
  auVar6 = auVar304 * ZEXT816(0x1000003d1) + auVar299 * auVar970;
  uVar1473 = auVar6._0_8_;
  auVar1371._8_8_ = 0;
  auVar1371._0_8_ = auVar6._8_8_ * 0x1000 | uVar1473 >> 0x34;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar1493;
  auVar975._8_8_ = 0;
  auVar975._0_8_ = uVar1488;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar1482;
  auVar976._8_8_ = 0;
  auVar976._0_8_ = uVar1495;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar1477;
  auVar977._8_8_ = 0;
  auVar977._0_8_ = uVar1492;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar1471;
  auVar978._8_8_ = 0;
  auVar978._0_8_ = uVar1465;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar1469;
  auVar979._8_8_ = 0;
  auVar979._0_8_ = uVar1463;
  auVar1438 = auVar307 * auVar977 + auVar309 * auVar979 + auVar308 * auVar978 + auVar1438;
  uVar1480 = auVar1438._0_8_;
  uVar1490 = auVar1438._8_8_;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar1480 & 0xfffffffffffff;
  auVar1371 = auVar310 * ZEXT816(0x1000003d10) + auVar305 * auVar975 + auVar306 * auVar976 +
              auVar1371;
  uVar1474 = auVar1371._0_8_;
  auVar1372._8_8_ = 0;
  auVar1372._0_8_ = auVar1371._8_8_ << 0xc | uVar1474 >> 0x34;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar1493;
  auVar980._8_8_ = 0;
  auVar980._0_8_ = uVar1469;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar1482;
  auVar981._8_8_ = 0;
  auVar981._0_8_ = uVar1488;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar1477;
  auVar982._8_8_ = 0;
  auVar982._0_8_ = uVar1495;
  auVar1320._8_8_ = uVar1490 >> 0x34;
  auVar1320._0_8_ = uVar1490 * 0x1000 | uVar1480 >> 0x34;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar1471;
  auVar983._8_8_ = 0;
  auVar983._0_8_ = uVar1492;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar1465;
  auVar984._8_8_ = 0;
  auVar984._0_8_ = uVar1463;
  auVar1320 = auVar315 * auVar984 + auVar314 * auVar983 + auVar1320;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = auVar1320._0_8_;
  auVar1372 = auVar316 * ZEXT816(0x1000003d10) +
              auVar313 * auVar982 + auVar312 * auVar981 + auVar311 * auVar980 + auVar1372;
  uVar1465 = auVar1372._0_8_;
  auVar1372 = auVar1372 >> 0x34;
  auVar1374._8_8_ = 0;
  auVar1374._0_8_ = auVar1372._0_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = auVar1320._8_8_;
  auVar1373._8_8_ = auVar1372._8_8_;
  auVar1373._0_8_ = uVar1466 & 0xfffffffffffff;
  auVar1374 = auVar317 * ZEXT816(0x1000003d10000) + auVar1373 + auVar1374;
  uVar1488 = auVar1374._0_8_;
  uVar1469 = (auVar1374._8_8_ << 0xc | uVar1488 >> 0x34) + (auVar1457._0_8_ & 0xffffffffffff);
  iVar1462 = 0x16;
  uVar1471 = uVar1465;
  uVar1463 = uVar1469;
  uVar1477 = uVar1488;
  uVar1482 = uVar1474;
  local_190 = uVar1473;
  do {
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1466 = uVar1482 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1492 = local_190 * 2;
    auVar318._8_8_ = 0;
    auVar318._0_8_ = uVar1492;
    auVar985._8_8_ = 0;
    auVar985._0_8_ = uVar1477;
    auVar319._8_8_ = 0;
    auVar319._0_8_ = uVar1466 * 2;
    auVar986._8_8_ = 0;
    auVar986._0_8_ = uVar1471;
    auVar320._8_8_ = 0;
    auVar320._0_8_ = uVar1463;
    auVar987._8_8_ = 0;
    auVar987._0_8_ = uVar1463;
    auVar321._8_8_ = 0;
    auVar321._0_8_ = SUB168(auVar320 * auVar987,0);
    auVar8 = auVar318 * auVar985 + auVar321 * ZEXT816(0x1000003d10) + auVar319 * auVar986;
    uVar1463 = uVar1463 * 2;
    auVar322._8_8_ = 0;
    auVar322._0_8_ = local_190;
    auVar988._8_8_ = 0;
    auVar988._0_8_ = uVar1463;
    auVar323._8_8_ = 0;
    auVar323._0_8_ = uVar1466 * 2;
    auVar989._8_8_ = 0;
    auVar989._0_8_ = uVar1477;
    auVar324._8_8_ = 0;
    auVar324._0_8_ = uVar1471;
    auVar990._8_8_ = 0;
    auVar990._0_8_ = uVar1471;
    auVar325._8_8_ = 0;
    auVar325._0_8_ = SUB168(auVar320 * auVar987,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar323 * auVar989 + auVar325 * ZEXT816(0x1000003d10000) + auVar324 * auVar990 +
             auVar322 * auVar988;
    auVar326._8_8_ = 0;
    auVar326._0_8_ = local_190;
    auVar991._8_8_ = 0;
    auVar991._0_8_ = local_190;
    auVar327._8_8_ = 0;
    auVar327._0_8_ = uVar1466;
    auVar992._8_8_ = 0;
    auVar992._0_8_ = uVar1463;
    auVar1321._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1321._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar328._8_8_ = 0;
    auVar328._0_8_ = uVar1471 * 2;
    auVar993._8_8_ = 0;
    auVar993._0_8_ = uVar1477;
    auVar1321 = auVar327 * auVar992 + auVar328 * auVar993 + auVar1321;
    auVar329._8_8_ = 0;
    auVar329._0_8_ = (auVar1321._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar329 * ZEXT816(0x1000003d1) + auVar326 * auVar991;
    local_190 = auVar6._0_8_;
    auVar330._8_8_ = 0;
    auVar330._0_8_ = uVar1492;
    auVar994._8_8_ = 0;
    auVar994._0_8_ = uVar1466;
    auVar1375._8_8_ = 0;
    auVar1375._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar331._8_8_ = 0;
    auVar331._0_8_ = uVar1471;
    auVar995._8_8_ = 0;
    auVar995._0_8_ = uVar1463;
    auVar332._8_8_ = 0;
    auVar332._0_8_ = uVar1477;
    auVar996._8_8_ = 0;
    auVar996._0_8_ = uVar1477;
    auVar6 = auVar332 * auVar996 + auVar331 * auVar995 + (auVar1321 >> 0x34);
    auVar333._8_8_ = 0;
    auVar333._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1375 = auVar333 * ZEXT816(0x1000003d10) + auVar330 * auVar994 + auVar1375;
    uVar1482 = auVar1375._0_8_;
    auVar334._8_8_ = 0;
    auVar334._0_8_ = uVar1492;
    auVar997._8_8_ = 0;
    auVar997._0_8_ = uVar1471;
    auVar335._8_8_ = 0;
    auVar335._0_8_ = uVar1466;
    auVar998._8_8_ = 0;
    auVar998._0_8_ = uVar1466;
    auVar336._8_8_ = 0;
    auVar336._0_8_ = uVar1477;
    auVar999._8_8_ = 0;
    auVar999._0_8_ = uVar1463;
    auVar6 = auVar336 * auVar999 + (auVar6 >> 0x34);
    auVar337._8_8_ = 0;
    auVar337._0_8_ = auVar6._0_8_;
    auVar7 = auVar337 * ZEXT816(0x1000003d10) + auVar335 * auVar998 + auVar334 * auVar997 +
             (auVar1375 >> 0x34);
    uVar1471 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1377._8_8_ = 0;
    auVar1377._0_8_ = auVar7._0_8_;
    auVar338._8_8_ = 0;
    auVar338._0_8_ = auVar6._8_8_;
    auVar1376._8_8_ = auVar7._8_8_;
    auVar1376._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1377 = auVar338 * ZEXT816(0x1000003d10000) + auVar1376 + auVar1377;
    uVar1477 = auVar1377._0_8_;
    uVar1463 = (auVar1377._8_8_ << 0xc | uVar1477 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_190 = local_190 & 0xfffffffffffff;
  uVar1488 = uVar1488 & 0xfffffffffffff;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = local_190;
  auVar1000._8_8_ = 0;
  auVar1000._0_8_ = uVar1488;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  uVar1465 = uVar1465 & 0xfffffffffffff;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar1482;
  auVar1001._8_8_ = 0;
  auVar1001._0_8_ = uVar1465;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  uVar1474 = uVar1474 & 0xfffffffffffff;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar1471;
  auVar1002._8_8_ = 0;
  auVar1002._0_8_ = uVar1474;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  uVar1473 = uVar1473 & 0xfffffffffffff;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar1477;
  auVar1003._8_8_ = 0;
  auVar1003._0_8_ = uVar1473;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar1463;
  auVar1004._8_8_ = 0;
  auVar1004._0_8_ = uVar1469;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = SUB168(auVar343 * auVar1004,0);
  auVar6 = auVar339 * auVar1000 +
           auVar340 * auVar1001 +
           auVar341 * auVar1002 + auVar344 * ZEXT816(0x1000003d10) + auVar342 * auVar1003;
  uVar1492 = auVar6._0_8_;
  uVar1466 = auVar6._8_8_;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = local_190;
  auVar1005._8_8_ = 0;
  auVar1005._0_8_ = uVar1469;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar1482;
  auVar1006._8_8_ = 0;
  auVar1006._0_8_ = uVar1488;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar1471;
  auVar1007._8_8_ = 0;
  auVar1007._0_8_ = uVar1465;
  auVar1459._8_8_ = uVar1466 >> 0x34;
  auVar1459._0_8_ = uVar1466 * 0x1000 | uVar1492 >> 0x34;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar1477;
  auVar1008._8_8_ = 0;
  auVar1008._0_8_ = uVar1474;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar1473;
  auVar1009._8_8_ = 0;
  auVar1009._0_8_ = uVar1463;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = SUB168(auVar343 * auVar1004,8);
  auVar1459 = auVar345 * auVar1005 +
              auVar346 * auVar1006 +
              auVar347 * auVar1007 +
              auVar350 * ZEXT816(0x1000003d10000) + auVar349 * auVar1009 + auVar348 * auVar1008 +
              auVar1459;
  auVar1439._8_8_ = auVar1459._8_8_ >> 0x34;
  auVar1439._0_8_ = auVar1459._8_8_ * 0x1000 | auVar1459._0_8_ >> 0x34;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = local_190;
  auVar1010._8_8_ = 0;
  auVar1010._0_8_ = uVar1473;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar1482;
  auVar1011._8_8_ = 0;
  auVar1011._0_8_ = uVar1469;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar1471;
  auVar1012._8_8_ = 0;
  auVar1012._0_8_ = uVar1488;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar1477;
  auVar1013._8_8_ = 0;
  auVar1013._0_8_ = uVar1465;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar1474;
  auVar1014._8_8_ = 0;
  auVar1014._0_8_ = uVar1463;
  auVar1439 = auVar352 * auVar1011 +
              auVar355 * auVar1014 + auVar354 * auVar1013 + auVar353 * auVar1012 + auVar1439;
  uVar1466 = auVar1439._0_8_;
  uVar1495 = auVar1439._8_8_;
  auVar1440._8_8_ = uVar1495 >> 0x34;
  auVar1440._0_8_ = uVar1495 * 0x1000 | uVar1466 >> 0x34;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar1466 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1459._6_2_ & 0xf);
  auVar6 = auVar351 * auVar1010 + auVar356 * ZEXT816(0x1000003d1);
  uVar1466 = auVar6._0_8_;
  auVar1378._8_8_ = 0;
  auVar1378._0_8_ = auVar6._8_8_ * 0x1000 | uVar1466 >> 0x34;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = local_190;
  auVar1015._8_8_ = 0;
  auVar1015._0_8_ = uVar1474;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar1482;
  auVar1016._8_8_ = 0;
  auVar1016._0_8_ = uVar1473;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar1471;
  auVar1017._8_8_ = 0;
  auVar1017._0_8_ = uVar1469;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar1477;
  auVar1018._8_8_ = 0;
  auVar1018._0_8_ = uVar1488;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar1465;
  auVar1019._8_8_ = 0;
  auVar1019._0_8_ = uVar1463;
  auVar1440 = auVar359 * auVar1017 + auVar361 * auVar1019 + auVar360 * auVar1018 + auVar1440;
  uVar1490 = auVar1440._0_8_;
  uVar1480 = auVar1440._8_8_;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar1490 & 0xfffffffffffff;
  auVar1378 = auVar362 * ZEXT816(0x1000003d10) + auVar357 * auVar1015 + auVar358 * auVar1016 +
              auVar1378;
  uVar1495 = auVar1378._0_8_;
  auVar1379._8_8_ = 0;
  auVar1379._0_8_ = auVar1378._8_8_ << 0xc | uVar1495 >> 0x34;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = local_190;
  auVar1020._8_8_ = 0;
  auVar1020._0_8_ = uVar1465;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar1482;
  auVar1021._8_8_ = 0;
  auVar1021._0_8_ = uVar1474;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar1471;
  auVar1022._8_8_ = 0;
  auVar1022._0_8_ = uVar1473;
  auVar1322._8_8_ = uVar1480 >> 0x34;
  auVar1322._0_8_ = uVar1480 * 0x1000 | uVar1490 >> 0x34;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar1477;
  auVar1023._8_8_ = 0;
  auVar1023._0_8_ = uVar1469;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar1488;
  auVar1024._8_8_ = 0;
  auVar1024._0_8_ = uVar1463;
  auVar1322 = auVar367 * auVar1024 + auVar366 * auVar1023 + auVar1322;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = auVar1322._0_8_;
  auVar1379 = auVar368 * ZEXT816(0x1000003d10) +
              auVar365 * auVar1022 + auVar364 * auVar1021 + auVar363 * auVar1020 + auVar1379;
  uVar1490 = auVar1379._0_8_;
  auVar1379 = auVar1379 >> 0x34;
  auVar1381._8_8_ = 0;
  auVar1381._0_8_ = auVar1379._0_8_;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = auVar1322._8_8_;
  auVar1380._8_8_ = auVar1379._8_8_;
  auVar1380._0_8_ = uVar1492 & 0xfffffffffffff;
  auVar1381 = auVar369 * ZEXT816(0x1000003d10000) + auVar1380 + auVar1381;
  uVar1492 = auVar1381._0_8_;
  uVar1480 = (auVar1381._8_8_ << 0xc | uVar1492 >> 0x34) + (auVar1459._0_8_ & 0xffffffffffff);
  iVar1462 = 0x2c;
  uVar1471 = uVar1495;
  uVar1477 = uVar1490;
  uVar1463 = uVar1480;
  uVar1482 = uVar1492;
  local_190 = uVar1466;
  do {
    uVar1482 = uVar1482 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1475 = uVar1471 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1493 = local_190 * 2;
    auVar370._8_8_ = 0;
    auVar370._0_8_ = uVar1493;
    auVar1025._8_8_ = 0;
    auVar1025._0_8_ = uVar1482;
    auVar371._8_8_ = 0;
    auVar371._0_8_ = uVar1475 * 2;
    auVar1026._8_8_ = 0;
    auVar1026._0_8_ = uVar1477;
    auVar372._8_8_ = 0;
    auVar372._0_8_ = uVar1463;
    auVar1027._8_8_ = 0;
    auVar1027._0_8_ = uVar1463;
    auVar373._8_8_ = 0;
    auVar373._0_8_ = SUB168(auVar372 * auVar1027,0);
    auVar8 = auVar370 * auVar1025 + auVar373 * ZEXT816(0x1000003d10) + auVar371 * auVar1026;
    uVar1463 = uVar1463 * 2;
    auVar374._8_8_ = 0;
    auVar374._0_8_ = local_190;
    auVar1028._8_8_ = 0;
    auVar1028._0_8_ = uVar1463;
    auVar375._8_8_ = 0;
    auVar375._0_8_ = uVar1475 * 2;
    auVar1029._8_8_ = 0;
    auVar1029._0_8_ = uVar1482;
    auVar376._8_8_ = 0;
    auVar376._0_8_ = uVar1477;
    auVar1030._8_8_ = 0;
    auVar1030._0_8_ = uVar1477;
    auVar377._8_8_ = 0;
    auVar377._0_8_ = SUB168(auVar372 * auVar1027,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar375 * auVar1029 + auVar377 * ZEXT816(0x1000003d10000) + auVar376 * auVar1030 +
             auVar374 * auVar1028;
    auVar378._8_8_ = 0;
    auVar378._0_8_ = local_190;
    auVar1031._8_8_ = 0;
    auVar1031._0_8_ = local_190;
    auVar379._8_8_ = 0;
    auVar379._0_8_ = uVar1475;
    auVar1032._8_8_ = 0;
    auVar1032._0_8_ = uVar1463;
    auVar1323._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1323._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar380._8_8_ = 0;
    auVar380._0_8_ = uVar1477 * 2;
    auVar1033._8_8_ = 0;
    auVar1033._0_8_ = uVar1482;
    auVar1323 = auVar379 * auVar1032 + auVar380 * auVar1033 + auVar1323;
    auVar381._8_8_ = 0;
    auVar381._0_8_ = (auVar1323._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar381 * ZEXT816(0x1000003d1) + auVar378 * auVar1031;
    local_190 = auVar6._0_8_;
    auVar382._8_8_ = 0;
    auVar382._0_8_ = uVar1493;
    auVar1034._8_8_ = 0;
    auVar1034._0_8_ = uVar1475;
    auVar1382._8_8_ = 0;
    auVar1382._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar383._8_8_ = 0;
    auVar383._0_8_ = uVar1477;
    auVar1035._8_8_ = 0;
    auVar1035._0_8_ = uVar1463;
    auVar384._8_8_ = 0;
    auVar384._0_8_ = uVar1482;
    auVar1036._8_8_ = 0;
    auVar1036._0_8_ = uVar1482;
    auVar6 = auVar384 * auVar1036 + auVar383 * auVar1035 + (auVar1323 >> 0x34);
    auVar385._8_8_ = 0;
    auVar385._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1382 = auVar385 * ZEXT816(0x1000003d10) + auVar382 * auVar1034 + auVar1382;
    uVar1471 = auVar1382._0_8_;
    auVar386._8_8_ = 0;
    auVar386._0_8_ = uVar1493;
    auVar1037._8_8_ = 0;
    auVar1037._0_8_ = uVar1477;
    auVar387._8_8_ = 0;
    auVar387._0_8_ = uVar1475;
    auVar1038._8_8_ = 0;
    auVar1038._0_8_ = uVar1475;
    auVar388._8_8_ = 0;
    auVar388._0_8_ = uVar1482;
    auVar1039._8_8_ = 0;
    auVar1039._0_8_ = uVar1463;
    auVar6 = auVar388 * auVar1039 + (auVar6 >> 0x34);
    auVar389._8_8_ = 0;
    auVar389._0_8_ = auVar6._0_8_;
    auVar7 = auVar389 * ZEXT816(0x1000003d10) + auVar387 * auVar1038 + auVar386 * auVar1037 +
             (auVar1382 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1384._8_8_ = 0;
    auVar1384._0_8_ = auVar7._0_8_;
    auVar390._8_8_ = 0;
    auVar390._0_8_ = auVar6._8_8_;
    auVar1383._8_8_ = auVar7._8_8_;
    auVar1383._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1384 = auVar390 * ZEXT816(0x1000003d10000) + auVar1383 + auVar1384;
    uVar1482 = auVar1384._0_8_;
    uVar1463 = (auVar1384._8_8_ << 0xc | uVar1482 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_190 = local_190 & 0xfffffffffffff;
  uVar1492 = uVar1492 & 0xfffffffffffff;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = local_190;
  auVar1040._8_8_ = 0;
  auVar1040._0_8_ = uVar1492;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  uVar1490 = uVar1490 & 0xfffffffffffff;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar1471;
  auVar1041._8_8_ = 0;
  auVar1041._0_8_ = uVar1490;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  uVar1495 = uVar1495 & 0xfffffffffffff;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar1477;
  auVar1042._8_8_ = 0;
  auVar1042._0_8_ = uVar1495;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  uVar1466 = uVar1466 & 0xfffffffffffff;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar1482;
  auVar1043._8_8_ = 0;
  auVar1043._0_8_ = uVar1466;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar1463;
  auVar1044._8_8_ = 0;
  auVar1044._0_8_ = uVar1480;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = SUB168(auVar395 * auVar1044,0);
  auVar6 = auVar391 * auVar1040 +
           auVar392 * auVar1041 +
           auVar393 * auVar1042 + auVar396 * ZEXT816(0x1000003d10) + auVar394 * auVar1043;
  uVar1493 = auVar6._0_8_;
  uVar1475 = auVar6._8_8_;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = local_190;
  auVar1045._8_8_ = 0;
  auVar1045._0_8_ = uVar1480;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar1471;
  auVar1046._8_8_ = 0;
  auVar1046._0_8_ = uVar1492;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar1477;
  auVar1047._8_8_ = 0;
  auVar1047._0_8_ = uVar1490;
  auVar1460._8_8_ = uVar1475 >> 0x34;
  auVar1460._0_8_ = uVar1475 * 0x1000 | uVar1493 >> 0x34;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar1482;
  auVar1048._8_8_ = 0;
  auVar1048._0_8_ = uVar1495;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar1466;
  auVar1049._8_8_ = 0;
  auVar1049._0_8_ = uVar1463;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = SUB168(auVar395 * auVar1044,8);
  auVar1460 = auVar397 * auVar1045 +
              auVar398 * auVar1046 +
              auVar402 * ZEXT816(0x1000003d10000) + auVar401 * auVar1049 + auVar400 * auVar1048 +
              auVar399 * auVar1047 + auVar1460;
  auVar1441._8_8_ = auVar1460._8_8_ >> 0x34;
  auVar1441._0_8_ = auVar1460._8_8_ * 0x1000 | auVar1460._0_8_ >> 0x34;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = local_190;
  auVar1050._8_8_ = 0;
  auVar1050._0_8_ = uVar1466;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar1471;
  auVar1051._8_8_ = 0;
  auVar1051._0_8_ = uVar1480;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar1477;
  auVar1052._8_8_ = 0;
  auVar1052._0_8_ = uVar1492;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar1482;
  auVar1053._8_8_ = 0;
  auVar1053._0_8_ = uVar1490;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar1495;
  auVar1054._8_8_ = 0;
  auVar1054._0_8_ = uVar1463;
  auVar1441 = auVar404 * auVar1051 +
              auVar405 * auVar1052 + auVar407 * auVar1054 + auVar406 * auVar1053 + auVar1441;
  uVar1475 = auVar1441._0_8_;
  uVar1470 = auVar1441._8_8_;
  auVar1442._8_8_ = uVar1470 >> 0x34;
  auVar1442._0_8_ = uVar1470 * 0x1000 | uVar1475 >> 0x34;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar1475 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1460._6_2_ & 0xf);
  auVar6 = auVar403 * auVar1050 + auVar408 * ZEXT816(0x1000003d1);
  uVar1475 = auVar6._0_8_;
  auVar1385._8_8_ = 0;
  auVar1385._0_8_ = auVar6._8_8_ * 0x1000 | uVar1475 >> 0x34;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = local_190;
  auVar1055._8_8_ = 0;
  auVar1055._0_8_ = uVar1495;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar1471;
  auVar1056._8_8_ = 0;
  auVar1056._0_8_ = uVar1466;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar1477;
  auVar1057._8_8_ = 0;
  auVar1057._0_8_ = uVar1480;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar1482;
  auVar1058._8_8_ = 0;
  auVar1058._0_8_ = uVar1492;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar1490;
  auVar1059._8_8_ = 0;
  auVar1059._0_8_ = uVar1463;
  auVar1442 = auVar411 * auVar1057 + auVar413 * auVar1059 + auVar412 * auVar1058 + auVar1442;
  uVar1470 = auVar1442._0_8_;
  uVar1494 = auVar1442._8_8_;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = uVar1470 & 0xfffffffffffff;
  auVar1385 = auVar414 * ZEXT816(0x1000003d10) + auVar409 * auVar1055 + auVar410 * auVar1056 +
              auVar1385;
  uVar1491 = auVar1385._0_8_;
  auVar1386._8_8_ = 0;
  auVar1386._0_8_ = auVar1385._8_8_ << 0xc | uVar1491 >> 0x34;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = local_190;
  auVar1060._8_8_ = 0;
  auVar1060._0_8_ = uVar1490;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar1471;
  auVar1061._8_8_ = 0;
  auVar1061._0_8_ = uVar1495;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar1477;
  auVar1062._8_8_ = 0;
  auVar1062._0_8_ = uVar1466;
  auVar1324._8_8_ = uVar1494 >> 0x34;
  auVar1324._0_8_ = uVar1494 * 0x1000 | uVar1470 >> 0x34;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar1482;
  auVar1063._8_8_ = 0;
  auVar1063._0_8_ = uVar1480;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar1492;
  auVar1064._8_8_ = 0;
  auVar1064._0_8_ = uVar1463;
  auVar1324 = auVar419 * auVar1064 + auVar418 * auVar1063 + auVar1324;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = auVar1324._0_8_;
  auVar1386 = auVar420 * ZEXT816(0x1000003d10) +
              auVar417 * auVar1062 + auVar416 * auVar1061 + auVar415 * auVar1060 + auVar1386;
  uVar1494 = auVar1386._0_8_;
  auVar1386 = auVar1386 >> 0x34;
  auVar1388._8_8_ = 0;
  auVar1388._0_8_ = auVar1386._0_8_;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = auVar1324._8_8_;
  auVar1387._8_8_ = auVar1386._8_8_;
  auVar1387._0_8_ = uVar1493 & 0xfffffffffffff;
  auVar1388 = auVar421 * ZEXT816(0x1000003d10000) + auVar1387 + auVar1388;
  uVar1493 = auVar1388._0_8_;
  uVar1470 = (auVar1388._8_8_ << 0xc | uVar1493 >> 0x34) + (auVar1460._0_8_ & 0xffffffffffff);
  iVar1462 = 0x58;
  uVar1463 = uVar1470;
  uVar1471 = uVar1493;
  uVar1477 = uVar1494;
  uVar1482 = uVar1491;
  local_190 = uVar1475;
  do {
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1481 = uVar1482 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1467 = local_190 * 2;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uVar1467;
    auVar1065._8_8_ = 0;
    auVar1065._0_8_ = uVar1471;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = uVar1481 * 2;
    auVar1066._8_8_ = 0;
    auVar1066._0_8_ = uVar1477;
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar1463;
    auVar1067._8_8_ = 0;
    auVar1067._0_8_ = uVar1463;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = SUB168(auVar424 * auVar1067,0);
    auVar8 = auVar422 * auVar1065 + auVar425 * ZEXT816(0x1000003d10) + auVar423 * auVar1066;
    uVar1463 = uVar1463 * 2;
    auVar426._8_8_ = 0;
    auVar426._0_8_ = local_190;
    auVar1068._8_8_ = 0;
    auVar1068._0_8_ = uVar1463;
    auVar427._8_8_ = 0;
    auVar427._0_8_ = uVar1481 * 2;
    auVar1069._8_8_ = 0;
    auVar1069._0_8_ = uVar1471;
    auVar428._8_8_ = 0;
    auVar428._0_8_ = uVar1477;
    auVar1070._8_8_ = 0;
    auVar1070._0_8_ = uVar1477;
    auVar429._8_8_ = 0;
    auVar429._0_8_ = SUB168(auVar424 * auVar1067,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar427 * auVar1069 + auVar429 * ZEXT816(0x1000003d10000) + auVar428 * auVar1070 +
             auVar426 * auVar1068;
    auVar430._8_8_ = 0;
    auVar430._0_8_ = local_190;
    auVar1071._8_8_ = 0;
    auVar1071._0_8_ = local_190;
    auVar431._8_8_ = 0;
    auVar431._0_8_ = uVar1481;
    auVar1072._8_8_ = 0;
    auVar1072._0_8_ = uVar1463;
    auVar1325._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1325._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar432._8_8_ = 0;
    auVar432._0_8_ = uVar1477 * 2;
    auVar1073._8_8_ = 0;
    auVar1073._0_8_ = uVar1471;
    auVar1325 = auVar432 * auVar1073 + auVar431 * auVar1072 + auVar1325;
    auVar433._8_8_ = 0;
    auVar433._0_8_ = (auVar1325._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar433 * ZEXT816(0x1000003d1) + auVar430 * auVar1071;
    local_190 = auVar6._0_8_;
    auVar434._8_8_ = 0;
    auVar434._0_8_ = uVar1467;
    auVar1074._8_8_ = 0;
    auVar1074._0_8_ = uVar1481;
    auVar1389._8_8_ = 0;
    auVar1389._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar435._8_8_ = 0;
    auVar435._0_8_ = uVar1477;
    auVar1075._8_8_ = 0;
    auVar1075._0_8_ = uVar1463;
    auVar436._8_8_ = 0;
    auVar436._0_8_ = uVar1471;
    auVar1076._8_8_ = 0;
    auVar1076._0_8_ = uVar1471;
    auVar6 = auVar436 * auVar1076 + auVar435 * auVar1075 + (auVar1325 >> 0x34);
    auVar437._8_8_ = 0;
    auVar437._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1389 = auVar437 * ZEXT816(0x1000003d10) + auVar434 * auVar1074 + auVar1389;
    uVar1482 = auVar1389._0_8_;
    auVar438._8_8_ = 0;
    auVar438._0_8_ = uVar1467;
    auVar1077._8_8_ = 0;
    auVar1077._0_8_ = uVar1477;
    auVar439._8_8_ = 0;
    auVar439._0_8_ = uVar1481;
    auVar1078._8_8_ = 0;
    auVar1078._0_8_ = uVar1481;
    auVar440._8_8_ = 0;
    auVar440._0_8_ = uVar1471;
    auVar1079._8_8_ = 0;
    auVar1079._0_8_ = uVar1463;
    auVar6 = auVar440 * auVar1079 + (auVar6 >> 0x34);
    auVar441._8_8_ = 0;
    auVar441._0_8_ = auVar6._0_8_;
    auVar7 = auVar441 * ZEXT816(0x1000003d10) + auVar439 * auVar1078 + auVar438 * auVar1077 +
             (auVar1389 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1391._8_8_ = 0;
    auVar1391._0_8_ = auVar7._0_8_;
    auVar442._8_8_ = 0;
    auVar442._0_8_ = auVar6._8_8_;
    auVar1390._8_8_ = auVar7._8_8_;
    auVar1390._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1391 = auVar442 * ZEXT816(0x1000003d10000) + auVar1390 + auVar1391;
    uVar1471 = auVar1391._0_8_;
    uVar1463 = (auVar1391._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_190 = local_190 & 0xfffffffffffff;
  uVar1493 = uVar1493 & 0xfffffffffffff;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = local_190;
  auVar1080._8_8_ = 0;
  auVar1080._0_8_ = uVar1493;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  uVar1494 = uVar1494 & 0xfffffffffffff;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar1482;
  auVar1081._8_8_ = 0;
  auVar1081._0_8_ = uVar1494;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  uVar1491 = uVar1491 & 0xfffffffffffff;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar1477;
  auVar1082._8_8_ = 0;
  auVar1082._0_8_ = uVar1491;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  uVar1475 = uVar1475 & 0xfffffffffffff;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar1471;
  auVar1083._8_8_ = 0;
  auVar1083._0_8_ = uVar1475;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uVar1463;
  auVar1084._8_8_ = 0;
  auVar1084._0_8_ = uVar1470;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = SUB168(auVar447 * auVar1084,0);
  auVar6 = auVar443 * auVar1080 +
           auVar444 * auVar1081 +
           auVar445 * auVar1082 + auVar448 * ZEXT816(0x1000003d10) + auVar446 * auVar1083;
  uVar1467 = auVar6._0_8_;
  uVar1481 = auVar6._8_8_;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = local_190;
  auVar1085._8_8_ = 0;
  auVar1085._0_8_ = uVar1470;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar1482;
  auVar1086._8_8_ = 0;
  auVar1086._0_8_ = uVar1493;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar1477;
  auVar1087._8_8_ = 0;
  auVar1087._0_8_ = uVar1494;
  auVar1458._8_8_ = uVar1481 >> 0x34;
  auVar1458._0_8_ = uVar1481 * 0x1000 | uVar1467 >> 0x34;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = uVar1471;
  auVar1088._8_8_ = 0;
  auVar1088._0_8_ = uVar1491;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uVar1475;
  auVar1089._8_8_ = 0;
  auVar1089._0_8_ = uVar1463;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = SUB168(auVar447 * auVar1084,8);
  auVar1458 = auVar449 * auVar1085 +
              auVar450 * auVar1086 +
              auVar451 * auVar1087 +
              auVar454 * ZEXT816(0x1000003d10000) + auVar453 * auVar1089 + auVar452 * auVar1088 +
              auVar1458;
  auVar1443._8_8_ = auVar1458._8_8_ >> 0x34;
  auVar1443._0_8_ = auVar1458._8_8_ * 0x1000 | auVar1458._0_8_ >> 0x34;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = local_190;
  auVar1090._8_8_ = 0;
  auVar1090._0_8_ = uVar1475;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar1482;
  auVar1091._8_8_ = 0;
  auVar1091._0_8_ = uVar1470;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = uVar1477;
  auVar1092._8_8_ = 0;
  auVar1092._0_8_ = uVar1493;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar1471;
  auVar1093._8_8_ = 0;
  auVar1093._0_8_ = uVar1494;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uVar1491;
  auVar1094._8_8_ = 0;
  auVar1094._0_8_ = uVar1463;
  auVar1443 = auVar456 * auVar1091 +
              auVar459 * auVar1094 + auVar458 * auVar1093 + auVar457 * auVar1092 + auVar1443;
  uVar1481 = auVar1443._0_8_;
  uVar1483 = auVar1443._8_8_;
  auVar1444._8_8_ = uVar1483 >> 0x34;
  auVar1444._0_8_ = uVar1483 * 0x1000 | uVar1481 >> 0x34;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uVar1481 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1458._6_2_ & 0xf);
  auVar6 = auVar455 * auVar1090 + auVar460 * ZEXT816(0x1000003d1);
  local_170 = auVar6._0_8_;
  auVar1392._8_8_ = 0;
  auVar1392._0_8_ = auVar6._8_8_ * 0x1000 | local_170 >> 0x34;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = local_190;
  auVar1095._8_8_ = 0;
  auVar1095._0_8_ = uVar1491;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar1482;
  auVar1096._8_8_ = 0;
  auVar1096._0_8_ = uVar1475;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar1477;
  auVar1097._8_8_ = 0;
  auVar1097._0_8_ = uVar1470;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar1471;
  auVar1098._8_8_ = 0;
  auVar1098._0_8_ = uVar1493;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar1494;
  auVar1099._8_8_ = 0;
  auVar1099._0_8_ = uVar1463;
  auVar1444 = auVar463 * auVar1097 + auVar465 * auVar1099 + auVar464 * auVar1098 + auVar1444;
  uVar1481 = auVar1444._0_8_;
  uVar1483 = auVar1444._8_8_;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar1481 & 0xfffffffffffff;
  auVar1392 = auVar466 * ZEXT816(0x1000003d10) + auVar461 * auVar1095 + auVar462 * auVar1096 +
              auVar1392;
  uVar1476 = auVar1392._0_8_;
  auVar1393._8_8_ = 0;
  auVar1393._0_8_ = auVar1392._8_8_ << 0xc | uVar1476 >> 0x34;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = local_190;
  auVar1100._8_8_ = 0;
  auVar1100._0_8_ = uVar1494;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar1482;
  auVar1101._8_8_ = 0;
  auVar1101._0_8_ = uVar1491;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar1477;
  auVar1102._8_8_ = 0;
  auVar1102._0_8_ = uVar1475;
  auVar1326._8_8_ = uVar1483 >> 0x34;
  auVar1326._0_8_ = uVar1483 * 0x1000 | uVar1481 >> 0x34;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar1471;
  auVar1103._8_8_ = 0;
  auVar1103._0_8_ = uVar1470;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = uVar1493;
  auVar1104._8_8_ = 0;
  auVar1104._0_8_ = uVar1463;
  auVar1326 = auVar471 * auVar1104 + auVar470 * auVar1103 + auVar1326;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = auVar1326._0_8_;
  auVar1393 = auVar472 * ZEXT816(0x1000003d10) +
              auVar467 * auVar1100 + auVar469 * auVar1102 + auVar468 * auVar1101 + auVar1393;
  uVar1471 = auVar1393._0_8_;
  auVar1393 = auVar1393 >> 0x34;
  auVar1395._8_8_ = 0;
  auVar1395._0_8_ = auVar1393._0_8_;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = auVar1326._8_8_;
  auVar1394._8_8_ = auVar1393._8_8_;
  auVar1394._0_8_ = uVar1467 & 0xfffffffffffff;
  auVar1395 = auVar473 * ZEXT816(0x1000003d10000) + auVar1394 + auVar1395;
  uVar1477 = auVar1395._0_8_;
  uVar1463 = (auVar1395._8_8_ << 0xc | uVar1477 >> 0x34) + (auVar1458._0_8_ & 0xffffffffffff);
  iVar1462 = 0x2c;
  do {
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1493 = uVar1476 & 0xfffffffffffff;
    local_170 = local_170 & 0xfffffffffffff;
    uVar1482 = local_170 * 2;
    auVar474._8_8_ = 0;
    auVar474._0_8_ = uVar1482;
    auVar1105._8_8_ = 0;
    auVar1105._0_8_ = uVar1477;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = uVar1493 * 2;
    auVar1106._8_8_ = 0;
    auVar1106._0_8_ = uVar1471;
    auVar476._8_8_ = 0;
    auVar476._0_8_ = uVar1463;
    auVar1107._8_8_ = 0;
    auVar1107._0_8_ = uVar1463;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = SUB168(auVar476 * auVar1107,0);
    auVar9 = auVar474 * auVar1105 + auVar477 * ZEXT816(0x1000003d10) + auVar475 * auVar1106;
    uVar1463 = uVar1463 * 2;
    auVar478._8_8_ = 0;
    auVar478._0_8_ = local_170;
    auVar1108._8_8_ = 0;
    auVar1108._0_8_ = uVar1463;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = uVar1493 * 2;
    auVar1109._8_8_ = 0;
    auVar1109._0_8_ = uVar1477;
    auVar480._8_8_ = 0;
    auVar480._0_8_ = uVar1471;
    auVar1110._8_8_ = 0;
    auVar1110._0_8_ = uVar1471;
    auVar481._8_8_ = 0;
    auVar481._0_8_ = SUB168(auVar476 * auVar1107,8);
    auVar6 = auVar479 * auVar1109 + auVar481 * ZEXT816(0x1000003d10000) + auVar480 * auVar1110 +
             auVar478 * auVar1108 + (auVar9 >> 0x34);
    auVar482._8_8_ = 0;
    auVar482._0_8_ = local_170;
    auVar1111._8_8_ = 0;
    auVar1111._0_8_ = local_170;
    auVar483._8_8_ = 0;
    auVar483._0_8_ = uVar1493;
    auVar1112._8_8_ = 0;
    auVar1112._0_8_ = uVar1463;
    auVar484._8_8_ = 0;
    auVar484._0_8_ = uVar1471 * 2;
    auVar1113._8_8_ = 0;
    auVar1113._0_8_ = uVar1477;
    auVar7 = auVar484 * auVar1113 + auVar483 * auVar1112 + (auVar6 >> 0x34);
    auVar485._8_8_ = 0;
    auVar485._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
    auVar8 = auVar485 * ZEXT816(0x1000003d1) + auVar482 * auVar1111;
    local_170 = auVar8._0_8_;
    auVar486._8_8_ = 0;
    auVar486._0_8_ = uVar1482;
    auVar1114._8_8_ = 0;
    auVar1114._0_8_ = uVar1493;
    auVar1396._8_8_ = 0;
    auVar1396._0_8_ = auVar8._8_8_ << 0xc | local_170 >> 0x34;
    auVar487._8_8_ = 0;
    auVar487._0_8_ = uVar1471;
    auVar1115._8_8_ = 0;
    auVar1115._0_8_ = uVar1463;
    auVar488._8_8_ = 0;
    auVar488._0_8_ = uVar1477;
    auVar1116._8_8_ = 0;
    auVar1116._0_8_ = uVar1477;
    auVar7 = auVar488 * auVar1116 + auVar487 * auVar1115 + (auVar7 >> 0x34);
    auVar489._8_8_ = 0;
    auVar489._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
    auVar1396 = auVar489 * ZEXT816(0x1000003d10) + auVar486 * auVar1114 + auVar1396;
    uVar1476 = auVar1396._0_8_;
    auVar490._8_8_ = 0;
    auVar490._0_8_ = uVar1482;
    auVar1117._8_8_ = 0;
    auVar1117._0_8_ = uVar1471;
    auVar491._8_8_ = 0;
    auVar491._0_8_ = uVar1493;
    auVar1118._8_8_ = 0;
    auVar1118._0_8_ = uVar1493;
    auVar492._8_8_ = 0;
    auVar492._0_8_ = uVar1477;
    auVar1119._8_8_ = 0;
    auVar1119._0_8_ = uVar1463;
    auVar7 = auVar492 * auVar1119 + (auVar7 >> 0x34);
    auVar493._8_8_ = 0;
    auVar493._0_8_ = auVar7._0_8_;
    auVar8 = auVar493 * ZEXT816(0x1000003d10) + auVar491 * auVar1118 + auVar490 * auVar1117 +
             (auVar1396 >> 0x34);
    uVar1471 = auVar8._0_8_;
    auVar8 = auVar8 >> 0x34;
    auVar1398._8_8_ = 0;
    auVar1398._0_8_ = auVar8._0_8_;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = auVar7._8_8_;
    auVar1397._8_8_ = auVar8._8_8_;
    auVar1397._0_8_ = auVar9._0_8_ & 0xffffffffffffe;
    auVar1398 = auVar494 * ZEXT816(0x1000003d10000) + auVar1397 + auVar1398;
    uVar1477 = auVar1398._0_8_;
    uVar1463 = (auVar1398._8_8_ << 0xc | uVar1477 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_170 = local_170 & 0xfffffffffffff;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = local_170;
  auVar1120._8_8_ = 0;
  auVar1120._0_8_ = uVar1492;
  uVar1476 = uVar1476 & 0xfffffffffffff;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar1476;
  auVar1121._8_8_ = 0;
  auVar1121._0_8_ = uVar1490;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar1471;
  auVar1122._8_8_ = 0;
  auVar1122._0_8_ = uVar1495;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar1477;
  auVar1123._8_8_ = 0;
  auVar1123._0_8_ = uVar1466;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar1463;
  auVar1124._8_8_ = 0;
  auVar1124._0_8_ = uVar1480;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = SUB168(auVar499 * auVar1124,0);
  auVar6 = auVar495 * auVar1120 +
           auVar496 * auVar1121 +
           auVar497 * auVar1122 + auVar500 * ZEXT816(0x1000003d10) + auVar498 * auVar1123;
  uVar1470 = auVar6._0_8_;
  uVar1482 = auVar6._8_8_;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = local_170;
  auVar1125._8_8_ = 0;
  auVar1125._0_8_ = uVar1480;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar1476;
  auVar1126._8_8_ = 0;
  auVar1126._0_8_ = uVar1492;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar1471;
  auVar1127._8_8_ = 0;
  auVar1127._0_8_ = uVar1490;
  auVar1445._8_8_ = uVar1482 >> 0x34;
  auVar1445._0_8_ = uVar1482 * 0x1000 | uVar1470 >> 0x34;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar1477;
  auVar1128._8_8_ = 0;
  auVar1128._0_8_ = uVar1495;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar1466;
  auVar1129._8_8_ = 0;
  auVar1129._0_8_ = uVar1463;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = SUB168(auVar499 * auVar1124,8);
  auVar1445 = auVar501 * auVar1125 +
              auVar502 * auVar1126 +
              auVar503 * auVar1127 +
              auVar506 * ZEXT816(0x1000003d10000) + auVar505 * auVar1129 + auVar504 * auVar1128 +
              auVar1445;
  auVar1446._8_8_ = auVar1445._8_8_ >> 0x34;
  auVar1446._0_8_ = auVar1445._8_8_ * 0x1000 | auVar1445._0_8_ >> 0x34;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = local_170;
  auVar1130._8_8_ = 0;
  auVar1130._0_8_ = uVar1466;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar1476;
  auVar1131._8_8_ = 0;
  auVar1131._0_8_ = uVar1480;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar1471;
  auVar1132._8_8_ = 0;
  auVar1132._0_8_ = uVar1492;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar1477;
  auVar1133._8_8_ = 0;
  auVar1133._0_8_ = uVar1490;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar1495;
  auVar1134._8_8_ = 0;
  auVar1134._0_8_ = uVar1463;
  auVar1446 = auVar508 * auVar1131 +
              auVar511 * auVar1134 + auVar510 * auVar1133 + auVar509 * auVar1132 + auVar1446;
  uVar1482 = auVar1446._0_8_;
  uVar1493 = auVar1446._8_8_;
  auVar1447._8_8_ = uVar1493 >> 0x34;
  auVar1447._0_8_ = uVar1493 * 0x1000 | uVar1482 >> 0x34;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar1482 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1445._6_2_ & 0xf);
  auVar6 = auVar507 * auVar1130 + auVar512 * ZEXT816(0x1000003d1);
  local_190 = auVar6._0_8_;
  auVar1399._8_8_ = 0;
  auVar1399._0_8_ = auVar6._8_8_ * 0x1000 | local_190 >> 0x34;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = local_170;
  auVar1135._8_8_ = 0;
  auVar1135._0_8_ = uVar1495;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar1476;
  auVar1136._8_8_ = 0;
  auVar1136._0_8_ = uVar1466;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = uVar1471;
  auVar1137._8_8_ = 0;
  auVar1137._0_8_ = uVar1480;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar1477;
  auVar1138._8_8_ = 0;
  auVar1138._0_8_ = uVar1492;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar1490;
  auVar1139._8_8_ = 0;
  auVar1139._0_8_ = uVar1463;
  auVar1447 = auVar515 * auVar1137 + auVar517 * auVar1139 + auVar516 * auVar1138 + auVar1447;
  uVar1482 = auVar1447._0_8_;
  uVar1475 = auVar1447._8_8_;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar1482 & 0xfffffffffffff;
  auVar1399 = auVar518 * ZEXT816(0x1000003d10) + auVar513 * auVar1135 + auVar514 * auVar1136 +
              auVar1399;
  uVar1493 = auVar1399._0_8_;
  auVar1327._8_8_ = uVar1475 >> 0x34;
  auVar1327._0_8_ = uVar1475 * 0x1000 | uVar1482 >> 0x34;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = local_170;
  auVar1140._8_8_ = 0;
  auVar1140._0_8_ = uVar1490;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar1476;
  auVar1141._8_8_ = 0;
  auVar1141._0_8_ = uVar1495;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar1471;
  auVar1142._8_8_ = 0;
  auVar1142._0_8_ = uVar1466;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uVar1477;
  auVar1143._8_8_ = 0;
  auVar1143._0_8_ = uVar1480;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = uVar1492;
  auVar1144._8_8_ = 0;
  auVar1144._0_8_ = uVar1463;
  auVar1327 = auVar523 * auVar1144 + auVar522 * auVar1143 + auVar1327;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = auVar1327._0_8_;
  auVar6 = auVar524 * ZEXT816(0x1000003d10) +
           auVar519 * auVar1140 + auVar521 * auVar1142 + auVar520 * auVar1141 + (auVar1399 >> 0x34);
  uVar1477 = auVar6._0_8_;
  auVar6 = auVar6 >> 0x34;
  auVar1401._8_8_ = 0;
  auVar1401._0_8_ = auVar6._0_8_;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = auVar1327._8_8_;
  auVar1400._8_8_ = auVar6._8_8_;
  auVar1400._0_8_ = uVar1470 & 0xfffffffffffff;
  auVar1401 = auVar525 * ZEXT816(0x1000003d10000) + auVar1400 + auVar1401;
  uVar1471 = auVar1401._0_8_;
  uVar1463 = (auVar1401._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar1445._0_8_ & 0xffffffffffff);
  iVar1462 = 3;
  do {
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1492 = uVar1493 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1482 = local_190 * 2;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = uVar1482;
    auVar1145._8_8_ = 0;
    auVar1145._0_8_ = uVar1471;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = uVar1492 * 2;
    auVar1146._8_8_ = 0;
    auVar1146._0_8_ = uVar1477;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = uVar1463;
    auVar1147._8_8_ = 0;
    auVar1147._0_8_ = uVar1463;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = SUB168(auVar528 * auVar1147,0);
    auVar8 = auVar526 * auVar1145 + auVar529 * ZEXT816(0x1000003d10) + auVar527 * auVar1146;
    uVar1463 = uVar1463 * 2;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = local_190;
    auVar1148._8_8_ = 0;
    auVar1148._0_8_ = uVar1463;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = uVar1492 * 2;
    auVar1149._8_8_ = 0;
    auVar1149._0_8_ = uVar1471;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = uVar1477;
    auVar1150._8_8_ = 0;
    auVar1150._0_8_ = uVar1477;
    auVar533._8_8_ = 0;
    auVar533._0_8_ = SUB168(auVar528 * auVar1147,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar531 * auVar1149 + auVar533 * ZEXT816(0x1000003d10000) + auVar532 * auVar1150 +
             auVar530 * auVar1148;
    auVar534._8_8_ = 0;
    auVar534._0_8_ = local_190;
    auVar1151._8_8_ = 0;
    auVar1151._0_8_ = local_190;
    auVar535._8_8_ = 0;
    auVar535._0_8_ = uVar1492;
    auVar1152._8_8_ = 0;
    auVar1152._0_8_ = uVar1463;
    auVar1328._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1328._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar536._8_8_ = 0;
    auVar536._0_8_ = uVar1477 * 2;
    auVar1153._8_8_ = 0;
    auVar1153._0_8_ = uVar1471;
    auVar1328 = auVar536 * auVar1153 + auVar535 * auVar1152 + auVar1328;
    auVar537._8_8_ = 0;
    auVar537._0_8_ = (auVar1328._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar537 * ZEXT816(0x1000003d1) + auVar534 * auVar1151;
    local_190 = auVar6._0_8_;
    auVar538._8_8_ = 0;
    auVar538._0_8_ = uVar1482;
    auVar1154._8_8_ = 0;
    auVar1154._0_8_ = uVar1492;
    auVar1402._8_8_ = 0;
    auVar1402._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar539._8_8_ = 0;
    auVar539._0_8_ = uVar1477;
    auVar1155._8_8_ = 0;
    auVar1155._0_8_ = uVar1463;
    auVar540._8_8_ = 0;
    auVar540._0_8_ = uVar1471;
    auVar1156._8_8_ = 0;
    auVar1156._0_8_ = uVar1471;
    auVar6 = auVar540 * auVar1156 + auVar539 * auVar1155 + (auVar1328 >> 0x34);
    auVar541._8_8_ = 0;
    auVar541._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1402 = auVar541 * ZEXT816(0x1000003d10) + auVar538 * auVar1154 + auVar1402;
    uVar1493 = auVar1402._0_8_;
    auVar542._8_8_ = 0;
    auVar542._0_8_ = uVar1482;
    auVar1157._8_8_ = 0;
    auVar1157._0_8_ = uVar1477;
    auVar543._8_8_ = 0;
    auVar543._0_8_ = uVar1492;
    auVar1158._8_8_ = 0;
    auVar1158._0_8_ = uVar1492;
    auVar544._8_8_ = 0;
    auVar544._0_8_ = uVar1471;
    auVar1159._8_8_ = 0;
    auVar1159._0_8_ = uVar1463;
    auVar6 = auVar544 * auVar1159 + (auVar6 >> 0x34);
    auVar545._8_8_ = 0;
    auVar545._0_8_ = auVar6._0_8_;
    auVar7 = auVar545 * ZEXT816(0x1000003d10) + auVar543 * auVar1158 + auVar542 * auVar1157 +
             (auVar1402 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1404._8_8_ = 0;
    auVar1404._0_8_ = auVar7._0_8_;
    auVar546._8_8_ = 0;
    auVar546._0_8_ = auVar6._8_8_;
    auVar1403._8_8_ = auVar7._8_8_;
    auVar1403._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1404 = auVar546 * ZEXT816(0x1000003d10000) + auVar1403 + auVar1404;
    uVar1471 = auVar1404._0_8_;
    uVar1463 = (auVar1404._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_190 = local_190 & 0xfffffffffffff;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = local_190;
  auVar1160._8_8_ = 0;
  auVar1160._0_8_ = uVar1486;
  uVar1493 = uVar1493 & 0xfffffffffffff;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = uVar1493;
  auVar1161._8_8_ = 0;
  auVar1161._0_8_ = uVar1487;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar1477;
  auVar1162._8_8_ = 0;
  auVar1162._0_8_ = uVar1479;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar1471;
  auVar1163._8_8_ = 0;
  auVar1163._0_8_ = uVar1489;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = uVar1463;
  auVar1164._8_8_ = 0;
  auVar1164._0_8_ = uVar1478;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = SUB168(auVar551 * auVar1164,0);
  auVar6 = auVar547 * auVar1160 +
           auVar548 * auVar1161 +
           auVar550 * auVar1163 + auVar552 * ZEXT816(0x1000003d10) + auVar549 * auVar1162;
  uVar1482 = auVar6._0_8_;
  uVar1492 = auVar6._8_8_;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = local_190;
  auVar1165._8_8_ = 0;
  auVar1165._0_8_ = uVar1478;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = uVar1493;
  auVar1166._8_8_ = 0;
  auVar1166._0_8_ = uVar1486;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = uVar1477;
  auVar1167._8_8_ = 0;
  auVar1167._0_8_ = uVar1487;
  auVar1448._8_8_ = uVar1492 >> 0x34;
  auVar1448._0_8_ = uVar1492 * 0x1000 | uVar1482 >> 0x34;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = uVar1471;
  auVar1168._8_8_ = 0;
  auVar1168._0_8_ = uVar1479;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = uVar1489;
  auVar1169._8_8_ = 0;
  auVar1169._0_8_ = uVar1463;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = SUB168(auVar551 * auVar1164,8);
  auVar1448 = auVar553 * auVar1165 +
              auVar554 * auVar1166 +
              auVar555 * auVar1167 +
              auVar558 * ZEXT816(0x1000003d10000) + auVar557 * auVar1169 + auVar556 * auVar1168 +
              auVar1448;
  auVar1329._8_8_ = auVar1448._8_8_ >> 0x34;
  auVar1329._0_8_ = auVar1448._8_8_ * 0x1000 | auVar1448._0_8_ >> 0x34;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = local_190;
  auVar1170._8_8_ = 0;
  auVar1170._0_8_ = uVar1489;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = uVar1493;
  auVar1171._8_8_ = 0;
  auVar1171._0_8_ = uVar1478;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = uVar1477;
  auVar1172._8_8_ = 0;
  auVar1172._0_8_ = uVar1486;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = uVar1471;
  auVar1173._8_8_ = 0;
  auVar1173._0_8_ = uVar1487;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = uVar1479;
  auVar1174._8_8_ = 0;
  auVar1174._0_8_ = uVar1463;
  auVar1329 = auVar563 * auVar1174 + auVar562 * auVar1173 + auVar561 * auVar1172 +
              auVar560 * auVar1171 + auVar1329;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = (auVar1329._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1448._6_2_ & 0xf);
  auVar6 = auVar559 * auVar1170 + auVar564 * ZEXT816(0x1000003d1);
  local_170 = auVar6._0_8_;
  auVar1405._8_8_ = 0;
  auVar1405._0_8_ = auVar6._8_8_ * 0x1000 | local_170 >> 0x34;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = local_190;
  auVar1175._8_8_ = 0;
  auVar1175._0_8_ = uVar1479;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = uVar1493;
  auVar1176._8_8_ = 0;
  auVar1176._0_8_ = uVar1489;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = uVar1477;
  auVar1177._8_8_ = 0;
  auVar1177._0_8_ = uVar1478;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = uVar1471;
  auVar1178._8_8_ = 0;
  auVar1178._0_8_ = uVar1486;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = uVar1487;
  auVar1179._8_8_ = 0;
  auVar1179._0_8_ = uVar1463;
  auVar6 = (auVar1329 >> 0x34) + auVar567 * auVar1177 + auVar569 * auVar1179 + auVar568 * auVar1178;
  uVar1495 = auVar6._0_8_;
  uVar1466 = auVar6._8_8_;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = uVar1495 & 0xfffffffffffff;
  auVar1405 = auVar570 * ZEXT816(0x1000003d10) + auVar565 * auVar1175 + auVar566 * auVar1176 +
              auVar1405;
  uVar1492 = auVar1405._0_8_;
  auVar1330._8_8_ = uVar1466 >> 0x34;
  auVar1330._0_8_ = uVar1466 * 0x1000 | uVar1495 >> 0x34;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = local_190;
  auVar1180._8_8_ = 0;
  auVar1180._0_8_ = uVar1487;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = uVar1493;
  auVar1181._8_8_ = 0;
  auVar1181._0_8_ = uVar1479;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = uVar1477;
  auVar1182._8_8_ = 0;
  auVar1182._0_8_ = uVar1489;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = uVar1471;
  auVar1183._8_8_ = 0;
  auVar1183._0_8_ = uVar1478;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = uVar1486;
  auVar1184._8_8_ = 0;
  auVar1184._0_8_ = uVar1463;
  auVar1330 = auVar575 * auVar1184 + auVar574 * auVar1183 + auVar1330;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = auVar1330._0_8_;
  auVar6 = auVar576 * ZEXT816(0x1000003d10) +
           auVar572 * auVar1181 + auVar573 * auVar1182 + auVar571 * auVar1180 + (auVar1405 >> 0x34);
  uVar1477 = auVar6._0_8_;
  auVar6 = auVar6 >> 0x34;
  auVar1407._8_8_ = 0;
  auVar1407._0_8_ = auVar6._0_8_;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = auVar1330._8_8_;
  auVar1406._8_8_ = auVar6._8_8_;
  auVar1406._0_8_ = uVar1482 & 0xfffffffffffff;
  auVar1407 = auVar577 * ZEXT816(0x1000003d10000) + auVar1406 + auVar1407;
  uVar1471 = auVar1407._0_8_;
  uVar1463 = (auVar1407._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar1448._0_8_ & 0xffffffffffff);
  iVar1462 = 0x17;
  do {
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1489 = uVar1492 & 0xfffffffffffff;
    local_170 = local_170 & 0xfffffffffffff;
    uVar1482 = local_170 * 2;
    auVar578._8_8_ = 0;
    auVar578._0_8_ = uVar1482;
    auVar1185._8_8_ = 0;
    auVar1185._0_8_ = uVar1471;
    auVar579._8_8_ = 0;
    auVar579._0_8_ = uVar1489 * 2;
    auVar1186._8_8_ = 0;
    auVar1186._0_8_ = uVar1477;
    auVar580._8_8_ = 0;
    auVar580._0_8_ = uVar1463;
    auVar1187._8_8_ = 0;
    auVar1187._0_8_ = uVar1463;
    auVar581._8_8_ = 0;
    auVar581._0_8_ = SUB168(auVar580 * auVar1187,0);
    auVar8 = auVar578 * auVar1185 + auVar581 * ZEXT816(0x1000003d10) + auVar579 * auVar1186;
    uVar1463 = uVar1463 * 2;
    auVar582._8_8_ = 0;
    auVar582._0_8_ = local_170;
    auVar1188._8_8_ = 0;
    auVar1188._0_8_ = uVar1463;
    auVar583._8_8_ = 0;
    auVar583._0_8_ = uVar1489 * 2;
    auVar1189._8_8_ = 0;
    auVar1189._0_8_ = uVar1471;
    auVar584._8_8_ = 0;
    auVar584._0_8_ = uVar1477;
    auVar1190._8_8_ = 0;
    auVar1190._0_8_ = uVar1477;
    auVar585._8_8_ = 0;
    auVar585._0_8_ = SUB168(auVar580 * auVar1187,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar583 * auVar1189 + auVar585 * ZEXT816(0x1000003d10000) + auVar584 * auVar1190 +
             auVar582 * auVar1188;
    auVar586._8_8_ = 0;
    auVar586._0_8_ = local_170;
    auVar1191._8_8_ = 0;
    auVar1191._0_8_ = local_170;
    auVar587._8_8_ = 0;
    auVar587._0_8_ = uVar1489;
    auVar1192._8_8_ = 0;
    auVar1192._0_8_ = uVar1463;
    auVar1331._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1331._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar588._8_8_ = 0;
    auVar588._0_8_ = uVar1477 * 2;
    auVar1193._8_8_ = 0;
    auVar1193._0_8_ = uVar1471;
    auVar1331 = auVar588 * auVar1193 + auVar587 * auVar1192 + auVar1331;
    auVar589._8_8_ = 0;
    auVar589._0_8_ = (auVar1331._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar589 * ZEXT816(0x1000003d1) + auVar586 * auVar1191;
    local_170 = auVar6._0_8_;
    auVar590._8_8_ = 0;
    auVar590._0_8_ = uVar1482;
    auVar1194._8_8_ = 0;
    auVar1194._0_8_ = uVar1489;
    auVar1408._8_8_ = 0;
    auVar1408._0_8_ = auVar6._8_8_ << 0xc | local_170 >> 0x34;
    auVar591._8_8_ = 0;
    auVar591._0_8_ = uVar1477;
    auVar1195._8_8_ = 0;
    auVar1195._0_8_ = uVar1463;
    auVar592._8_8_ = 0;
    auVar592._0_8_ = uVar1471;
    auVar1196._8_8_ = 0;
    auVar1196._0_8_ = uVar1471;
    auVar6 = auVar592 * auVar1196 + auVar591 * auVar1195 + (auVar1331 >> 0x34);
    auVar593._8_8_ = 0;
    auVar593._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1408 = auVar593 * ZEXT816(0x1000003d10) + auVar590 * auVar1194 + auVar1408;
    uVar1492 = auVar1408._0_8_;
    auVar594._8_8_ = 0;
    auVar594._0_8_ = uVar1482;
    auVar1197._8_8_ = 0;
    auVar1197._0_8_ = uVar1477;
    auVar595._8_8_ = 0;
    auVar595._0_8_ = uVar1489;
    auVar1198._8_8_ = 0;
    auVar1198._0_8_ = uVar1489;
    auVar596._8_8_ = 0;
    auVar596._0_8_ = uVar1471;
    auVar1199._8_8_ = 0;
    auVar1199._0_8_ = uVar1463;
    auVar6 = auVar596 * auVar1199 + (auVar6 >> 0x34);
    auVar597._8_8_ = 0;
    auVar597._0_8_ = auVar6._0_8_;
    auVar7 = auVar597 * ZEXT816(0x1000003d10) + auVar595 * auVar1198 + auVar594 * auVar1197 +
             (auVar1408 >> 0x34);
    uVar1477 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1410._8_8_ = 0;
    auVar1410._0_8_ = auVar7._0_8_;
    auVar598._8_8_ = 0;
    auVar598._0_8_ = auVar6._8_8_;
    auVar1409._8_8_ = auVar7._8_8_;
    auVar1409._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1410 = auVar598 * ZEXT816(0x1000003d10000) + auVar1409 + auVar1410;
    uVar1471 = auVar1410._0_8_;
    uVar1463 = (auVar1410._8_8_ << 0xc | uVar1471 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_170 = local_170 & 0xfffffffffffff;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = local_170;
  auVar1200._8_8_ = 0;
  auVar1200._0_8_ = uVar1488;
  uVar1492 = uVar1492 & 0xfffffffffffff;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = uVar1492;
  auVar1201._8_8_ = 0;
  auVar1201._0_8_ = uVar1465;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = uVar1477;
  auVar1202._8_8_ = 0;
  auVar1202._0_8_ = uVar1474;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = uVar1471;
  auVar1203._8_8_ = 0;
  auVar1203._0_8_ = uVar1473;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = uVar1463;
  auVar1204._8_8_ = 0;
  auVar1204._0_8_ = uVar1469;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = SUB168(auVar603 * auVar1204,0);
  auVar6 = auVar599 * auVar1200 +
           auVar600 * auVar1201 +
           auVar602 * auVar1203 + auVar604 * ZEXT816(0x1000003d10) + auVar601 * auVar1202;
  uVar1482 = auVar6._0_8_;
  uVar1489 = auVar6._8_8_;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = local_170;
  auVar1205._8_8_ = 0;
  auVar1205._0_8_ = uVar1469;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = uVar1492;
  auVar1206._8_8_ = 0;
  auVar1206._0_8_ = uVar1488;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = uVar1477;
  auVar1207._8_8_ = 0;
  auVar1207._0_8_ = uVar1465;
  auVar1449._8_8_ = uVar1489 >> 0x34;
  auVar1449._0_8_ = uVar1489 * 0x1000 | uVar1482 >> 0x34;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = uVar1471;
  auVar1208._8_8_ = 0;
  auVar1208._0_8_ = uVar1474;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = uVar1473;
  auVar1209._8_8_ = 0;
  auVar1209._0_8_ = uVar1463;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = SUB168(auVar603 * auVar1204,8);
  auVar1449 = auVar605 * auVar1205 +
              auVar606 * auVar1206 +
              auVar607 * auVar1207 +
              auVar610 * ZEXT816(0x1000003d10000) + auVar609 * auVar1209 + auVar608 * auVar1208 +
              auVar1449;
  auVar1332._8_8_ = auVar1449._8_8_ >> 0x34;
  auVar1332._0_8_ = auVar1449._8_8_ * 0x1000 | auVar1449._0_8_ >> 0x34;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = local_170;
  auVar1210._8_8_ = 0;
  auVar1210._0_8_ = uVar1473;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = uVar1492;
  auVar1211._8_8_ = 0;
  auVar1211._0_8_ = uVar1469;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = uVar1477;
  auVar1212._8_8_ = 0;
  auVar1212._0_8_ = uVar1488;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = uVar1471;
  auVar1213._8_8_ = 0;
  auVar1213._0_8_ = uVar1465;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = uVar1474;
  auVar1214._8_8_ = 0;
  auVar1214._0_8_ = uVar1463;
  auVar1332 = auVar615 * auVar1214 + auVar614 * auVar1213 + auVar613 * auVar1212 +
              auVar612 * auVar1211 + auVar1332;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = (auVar1332._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1449._6_2_ & 0xf);
  auVar6 = auVar611 * auVar1210 + auVar616 * ZEXT816(0x1000003d1);
  local_190 = auVar6._0_8_;
  auVar1411._8_8_ = 0;
  auVar1411._0_8_ = auVar6._8_8_ * 0x1000 | local_190 >> 0x34;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = local_170;
  auVar1215._8_8_ = 0;
  auVar1215._0_8_ = uVar1474;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = uVar1492;
  auVar1216._8_8_ = 0;
  auVar1216._0_8_ = uVar1473;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = uVar1477;
  auVar1217._8_8_ = 0;
  auVar1217._0_8_ = uVar1469;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uVar1471;
  auVar1218._8_8_ = 0;
  auVar1218._0_8_ = uVar1488;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = uVar1465;
  auVar1219._8_8_ = 0;
  auVar1219._0_8_ = uVar1463;
  auVar6 = (auVar1332 >> 0x34) + auVar619 * auVar1217 + auVar621 * auVar1219 + auVar620 * auVar1218;
  uVar1486 = auVar6._0_8_;
  uVar1478 = auVar6._8_8_;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = uVar1486 & 0xfffffffffffff;
  auVar1411 = auVar622 * ZEXT816(0x1000003d10) + auVar617 * auVar1215 + auVar618 * auVar1216 +
              auVar1411;
  uVar1489 = auVar1411._0_8_;
  auVar1333._8_8_ = uVar1478 >> 0x34;
  auVar1333._0_8_ = uVar1478 * 0x1000 | uVar1486 >> 0x34;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = local_170;
  auVar1220._8_8_ = 0;
  auVar1220._0_8_ = uVar1465;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = uVar1492;
  auVar1221._8_8_ = 0;
  auVar1221._0_8_ = uVar1474;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = uVar1477;
  auVar1222._8_8_ = 0;
  auVar1222._0_8_ = uVar1473;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uVar1471;
  auVar1223._8_8_ = 0;
  auVar1223._0_8_ = uVar1469;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = uVar1488;
  auVar1224._8_8_ = 0;
  auVar1224._0_8_ = uVar1463;
  auVar1333 = auVar627 * auVar1224 + auVar626 * auVar1223 + auVar1333;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = auVar1333._0_8_;
  auVar6 = auVar628 * ZEXT816(0x1000003d10) +
           auVar625 * auVar1222 + auVar624 * auVar1221 + auVar623 * auVar1220 + (auVar1411 >> 0x34);
  uVar1471 = auVar6._0_8_;
  auVar6 = auVar6 >> 0x34;
  auVar1413._8_8_ = 0;
  auVar1413._0_8_ = auVar6._0_8_;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = auVar1333._8_8_;
  auVar1412._8_8_ = auVar6._8_8_;
  auVar1412._0_8_ = uVar1482 & 0xfffffffffffff;
  auVar1413 = auVar629 * ZEXT816(0x1000003d10000) + auVar1412 + auVar1413;
  uVar1477 = auVar1413._0_8_;
  uVar1463 = (auVar1413._8_8_ << 0xc | uVar1477 >> 0x34) + (auVar1449._0_8_ & 0xffffffffffff);
  iVar1462 = 6;
  do {
    uVar1477 = uVar1477 & 0xfffffffffffff;
    uVar1471 = uVar1471 & 0xfffffffffffff;
    uVar1478 = uVar1489 & 0xfffffffffffff;
    local_190 = local_190 & 0xfffffffffffff;
    uVar1482 = local_190 * 2;
    auVar630._8_8_ = 0;
    auVar630._0_8_ = uVar1482;
    auVar1225._8_8_ = 0;
    auVar1225._0_8_ = uVar1477;
    auVar631._8_8_ = 0;
    auVar631._0_8_ = uVar1478 * 2;
    auVar1226._8_8_ = 0;
    auVar1226._0_8_ = uVar1471;
    auVar632._8_8_ = 0;
    auVar632._0_8_ = uVar1463;
    auVar1227._8_8_ = 0;
    auVar1227._0_8_ = uVar1463;
    auVar633._8_8_ = 0;
    auVar633._0_8_ = SUB168(auVar632 * auVar1227,0);
    auVar8 = auVar630 * auVar1225 + auVar633 * ZEXT816(0x1000003d10) + auVar631 * auVar1226;
    uVar1463 = uVar1463 * 2;
    auVar634._8_8_ = 0;
    auVar634._0_8_ = local_190;
    auVar1228._8_8_ = 0;
    auVar1228._0_8_ = uVar1463;
    auVar635._8_8_ = 0;
    auVar635._0_8_ = uVar1478 * 2;
    auVar1229._8_8_ = 0;
    auVar1229._0_8_ = uVar1477;
    auVar636._8_8_ = 0;
    auVar636._0_8_ = uVar1471;
    auVar1230._8_8_ = 0;
    auVar1230._0_8_ = uVar1471;
    auVar637._8_8_ = 0;
    auVar637._0_8_ = SUB168(auVar632 * auVar1227,8);
    auVar9 = (auVar8 >> 0x34) +
             auVar635 * auVar1229 + auVar637 * ZEXT816(0x1000003d10000) + auVar636 * auVar1230 +
             auVar634 * auVar1228;
    auVar638._8_8_ = 0;
    auVar638._0_8_ = local_190;
    auVar1231._8_8_ = 0;
    auVar1231._0_8_ = local_190;
    auVar639._8_8_ = 0;
    auVar639._0_8_ = uVar1478;
    auVar1232._8_8_ = 0;
    auVar1232._0_8_ = uVar1463;
    auVar1334._8_8_ = auVar9._8_8_ >> 0x34;
    auVar1334._0_8_ = auVar9._8_8_ * 0x1000 | auVar9._0_8_ >> 0x34;
    auVar640._8_8_ = 0;
    auVar640._0_8_ = uVar1471 * 2;
    auVar1233._8_8_ = 0;
    auVar1233._0_8_ = uVar1477;
    auVar1334 = auVar640 * auVar1233 + auVar639 * auVar1232 + auVar1334;
    auVar641._8_8_ = 0;
    auVar641._0_8_ = (auVar1334._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar9._6_2_ & 0xf);
    auVar6 = auVar641 * ZEXT816(0x1000003d1) + auVar638 * auVar1231;
    local_190 = auVar6._0_8_;
    auVar642._8_8_ = 0;
    auVar642._0_8_ = uVar1482;
    auVar1234._8_8_ = 0;
    auVar1234._0_8_ = uVar1478;
    auVar1414._8_8_ = 0;
    auVar1414._0_8_ = auVar6._8_8_ << 0xc | local_190 >> 0x34;
    auVar643._8_8_ = 0;
    auVar643._0_8_ = uVar1471;
    auVar1235._8_8_ = 0;
    auVar1235._0_8_ = uVar1463;
    auVar644._8_8_ = 0;
    auVar644._0_8_ = uVar1477;
    auVar1236._8_8_ = 0;
    auVar1236._0_8_ = uVar1477;
    auVar6 = auVar644 * auVar1236 + auVar643 * auVar1235 + (auVar1334 >> 0x34);
    auVar645._8_8_ = 0;
    auVar645._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar1414 = auVar645 * ZEXT816(0x1000003d10) + auVar642 * auVar1234 + auVar1414;
    uVar1489 = auVar1414._0_8_;
    auVar646._8_8_ = 0;
    auVar646._0_8_ = uVar1482;
    auVar1237._8_8_ = 0;
    auVar1237._0_8_ = uVar1471;
    auVar647._8_8_ = 0;
    auVar647._0_8_ = uVar1478;
    auVar1238._8_8_ = 0;
    auVar1238._0_8_ = uVar1478;
    auVar648._8_8_ = 0;
    auVar648._0_8_ = uVar1477;
    auVar1239._8_8_ = 0;
    auVar1239._0_8_ = uVar1463;
    auVar6 = auVar648 * auVar1239 + (auVar6 >> 0x34);
    auVar649._8_8_ = 0;
    auVar649._0_8_ = auVar6._0_8_;
    auVar7 = auVar649 * ZEXT816(0x1000003d10) + auVar647 * auVar1238 + auVar646 * auVar1237 +
             (auVar1414 >> 0x34);
    uVar1471 = auVar7._0_8_;
    auVar7 = auVar7 >> 0x34;
    auVar1416._8_8_ = 0;
    auVar1416._0_8_ = auVar7._0_8_;
    auVar650._8_8_ = 0;
    auVar650._0_8_ = auVar6._8_8_;
    auVar1415._8_8_ = auVar7._8_8_;
    auVar1415._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
    auVar1416 = auVar650 * ZEXT816(0x1000003d10000) + auVar1415 + auVar1416;
    uVar1477 = auVar1416._0_8_;
    uVar1463 = (auVar1416._8_8_ << 0xc | uVar1477 >> 0x34) + (auVar9._0_8_ & 0xffffffffffff);
    iVar1462 = iVar1462 + -1;
  } while (iVar1462 != 0);
  local_190 = local_190 & 0xfffffffffffff;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = local_190;
  auVar1240._8_8_ = 0;
  auVar1240._0_8_ = uVar1485;
  uVar1489 = uVar1489 & 0xfffffffffffff;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = uVar1489;
  auVar1241._8_8_ = 0;
  auVar1241._0_8_ = uVar1472;
  uVar1471 = uVar1471 & 0xfffffffffffff;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = uVar1471;
  auVar1242._8_8_ = 0;
  auVar1242._0_8_ = uVar1484;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = uVar1477;
  auVar1243._8_8_ = 0;
  auVar1243._0_8_ = uVar1464;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = uVar1463;
  auVar1244._8_8_ = 0;
  auVar1244._0_8_ = uVar1468;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = SUB168(auVar655 * auVar1244,0);
  auVar6 = auVar651 * auVar1240 +
           auVar652 * auVar1241 +
           auVar654 * auVar1243 + auVar656 * ZEXT816(0x1000003d10) + auVar653 * auVar1242;
  uVar1482 = auVar6._0_8_;
  uVar1478 = auVar6._8_8_;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = local_190;
  auVar1245._8_8_ = 0;
  auVar1245._0_8_ = uVar1468;
  auVar658._8_8_ = 0;
  auVar658._0_8_ = uVar1489;
  auVar1246._8_8_ = 0;
  auVar1246._0_8_ = uVar1485;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = uVar1471;
  auVar1247._8_8_ = 0;
  auVar1247._0_8_ = uVar1472;
  auVar1450._8_8_ = uVar1478 >> 0x34;
  auVar1450._0_8_ = uVar1478 * 0x1000 | uVar1482 >> 0x34;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = uVar1477;
  auVar1248._8_8_ = 0;
  auVar1248._0_8_ = uVar1484;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = uVar1464;
  auVar1249._8_8_ = 0;
  auVar1249._0_8_ = uVar1463;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = SUB168(auVar655 * auVar1244,8);
  auVar1450 = auVar657 * auVar1245 +
              auVar658 * auVar1246 +
              auVar662 * ZEXT816(0x1000003d10000) + auVar661 * auVar1249 + auVar660 * auVar1248 +
              auVar659 * auVar1247 + auVar1450;
  auVar1451._8_8_ = auVar1450._8_8_ >> 0x34;
  auVar1451._0_8_ = auVar1450._8_8_ * 0x1000 | auVar1450._0_8_ >> 0x34;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = local_190;
  auVar1250._8_8_ = 0;
  auVar1250._0_8_ = uVar1464;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = uVar1489;
  auVar1251._8_8_ = 0;
  auVar1251._0_8_ = uVar1468;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = uVar1471;
  auVar1252._8_8_ = 0;
  auVar1252._0_8_ = uVar1485;
  auVar666._8_8_ = 0;
  auVar666._0_8_ = uVar1477;
  auVar1253._8_8_ = 0;
  auVar1253._0_8_ = uVar1472;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = uVar1484;
  auVar1254._8_8_ = 0;
  auVar1254._0_8_ = uVar1463;
  auVar1451 = auVar664 * auVar1251 +
              auVar665 * auVar1252 + auVar667 * auVar1254 + auVar666 * auVar1253 + auVar1451;
  uVar1478 = auVar1451._0_8_;
  uVar1486 = auVar1451._8_8_;
  auVar1452._8_8_ = uVar1486 >> 0x34;
  auVar1452._0_8_ = uVar1486 * 0x1000 | uVar1478 >> 0x34;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = uVar1478 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar1450._6_2_ & 0xf);
  auVar6 = auVar663 * auVar1250 + auVar668 * ZEXT816(0x1000003d1);
  uVar1478 = auVar6._0_8_;
  auVar1417._8_8_ = 0;
  auVar1417._0_8_ = auVar6._8_8_ * 0x1000 | uVar1478 >> 0x34;
  auVar669._8_8_ = 0;
  auVar669._0_8_ = local_190;
  auVar1255._8_8_ = 0;
  auVar1255._0_8_ = uVar1484;
  auVar670._8_8_ = 0;
  auVar670._0_8_ = uVar1489;
  auVar1256._8_8_ = 0;
  auVar1256._0_8_ = uVar1464;
  auVar671._8_8_ = 0;
  auVar671._0_8_ = uVar1471;
  auVar1257._8_8_ = 0;
  auVar1257._0_8_ = uVar1468;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = uVar1477;
  auVar1258._8_8_ = 0;
  auVar1258._0_8_ = uVar1485;
  auVar673._8_8_ = 0;
  auVar673._0_8_ = uVar1472;
  auVar1259._8_8_ = 0;
  auVar1259._0_8_ = uVar1463;
  auVar1452 = auVar671 * auVar1257 + auVar673 * auVar1259 + auVar672 * auVar1258 + auVar1452;
  uVar1487 = auVar1452._0_8_;
  uVar1479 = auVar1452._8_8_;
  auVar674._8_8_ = 0;
  auVar674._0_8_ = uVar1487 & 0xfffffffffffff;
  auVar1417 = auVar674 * ZEXT816(0x1000003d10) + auVar670 * auVar1256 + auVar669 * auVar1255 +
              auVar1417;
  uVar1486 = auVar1417._0_8_;
  auVar1335._8_8_ = uVar1479 >> 0x34;
  auVar1335._0_8_ = uVar1479 * 0x1000 | uVar1487 >> 0x34;
  auVar675._8_8_ = 0;
  auVar675._0_8_ = local_190;
  auVar1260._8_8_ = 0;
  auVar1260._0_8_ = uVar1472;
  auVar676._8_8_ = 0;
  auVar676._0_8_ = uVar1489;
  auVar1261._8_8_ = 0;
  auVar1261._0_8_ = uVar1484;
  auVar677._8_8_ = 0;
  auVar677._0_8_ = uVar1471;
  auVar1262._8_8_ = 0;
  auVar1262._0_8_ = uVar1464;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = uVar1477;
  auVar1263._8_8_ = 0;
  auVar1263._0_8_ = uVar1468;
  auVar679._8_8_ = 0;
  auVar679._0_8_ = uVar1485;
  auVar1264._8_8_ = 0;
  auVar1264._0_8_ = uVar1463;
  auVar1335 = auVar679 * auVar1264 + auVar678 * auVar1263 + auVar1335;
  auVar680._8_8_ = 0;
  auVar680._0_8_ = auVar1335._0_8_;
  auVar6 = auVar680 * ZEXT816(0x1000003d10) +
           auVar677 * auVar1262 + auVar676 * auVar1261 + auVar675 * auVar1260 + (auVar1417 >> 0x34);
  uVar1477 = auVar6._0_8_;
  auVar6 = auVar6 >> 0x34;
  auVar1419._8_8_ = 0;
  auVar1419._0_8_ = auVar6._0_8_;
  auVar681._8_8_ = 0;
  auVar681._0_8_ = auVar1335._8_8_;
  auVar1418._8_8_ = auVar6._8_8_;
  auVar1418._0_8_ = uVar1482 & 0xfffffffffffff;
  auVar1419 = auVar681 * ZEXT816(0x1000003d10000) + auVar1418 + auVar1419;
  uVar1463 = auVar1419._0_8_;
  uVar1489 = uVar1478 * 2 & 0x1ffffffffffffe;
  uVar1464 = uVar1463 & 0xfffffffffffff;
  auVar682._8_8_ = 0;
  auVar682._0_8_ = uVar1464;
  auVar1265._8_8_ = 0;
  auVar1265._0_8_ = uVar1489;
  uVar1463 = (auVar1419._8_8_ << 0xc | uVar1463 >> 0x34) + (auVar1450._0_8_ & 0xffffffffffff);
  uVar1482 = uVar1486 * 2 & 0x1ffffffffffffe;
  uVar1484 = uVar1477 & 0xfffffffffffff;
  auVar683._8_8_ = 0;
  auVar683._0_8_ = uVar1484;
  auVar1266._8_8_ = 0;
  auVar1266._0_8_ = uVar1482;
  auVar684._8_8_ = 0;
  auVar684._0_8_ = uVar1463;
  auVar1267._8_8_ = 0;
  auVar1267._0_8_ = uVar1463;
  auVar685._8_8_ = 0;
  auVar685._0_8_ = SUB168(auVar684 * auVar1267,0);
  auVar6 = auVar683 * auVar1266 + auVar682 * auVar1265 + auVar685 * ZEXT816(0x1000003d10);
  uVar1471 = auVar6._0_8_;
  auVar1420._8_8_ = 0;
  auVar1420._0_8_ = auVar6._8_8_ << 0xc | uVar1471 >> 0x34;
  uVar1463 = uVar1463 * 2;
  uVar1478 = uVar1478 & 0xfffffffffffff;
  auVar686._8_8_ = 0;
  auVar686._0_8_ = uVar1478;
  auVar1268._8_8_ = 0;
  auVar1268._0_8_ = uVar1463;
  auVar687._8_8_ = 0;
  auVar687._0_8_ = uVar1464;
  auVar1269._8_8_ = 0;
  auVar1269._0_8_ = uVar1482;
  auVar688._8_8_ = 0;
  auVar688._0_8_ = uVar1484;
  auVar1270._8_8_ = 0;
  auVar1270._0_8_ = uVar1484;
  auVar689._8_8_ = 0;
  auVar689._0_8_ = SUB168(auVar684 * auVar1267,8);
  auVar1420 = auVar689 * ZEXT816(0x1000003d10000) +
              auVar686 * auVar1268 + auVar688 * auVar1270 + auVar687 * auVar1269 + auVar1420;
  auVar690._8_8_ = 0;
  auVar690._0_8_ = uVar1478;
  auVar1271._8_8_ = 0;
  auVar1271._0_8_ = uVar1478;
  uVar1486 = uVar1486 & 0xfffffffffffff;
  auVar691._8_8_ = 0;
  auVar691._0_8_ = uVar1486;
  auVar1272._8_8_ = 0;
  auVar1272._0_8_ = uVar1463;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = uVar1464;
  auVar1273._8_8_ = 0;
  auVar1273._0_8_ = uVar1477 * 2 & 0x1ffffffffffffe;
  auVar6 = auVar692 * auVar1273 + auVar691 * auVar1272 + (auVar1420 >> 0x34);
  auVar693._8_8_ = 0;
  auVar693._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1420._6_2_ & 0xf);
  auVar7 = auVar693 * ZEXT816(0x1000003d1) + auVar690 * auVar1271;
  uVar1477 = auVar7._0_8_;
  auVar1453._8_8_ = 0;
  auVar1453._0_8_ = auVar7._8_8_ << 0xc | uVar1477 >> 0x34;
  auVar694._8_8_ = 0;
  auVar694._0_8_ = uVar1486;
  auVar1274._8_8_ = 0;
  auVar1274._0_8_ = uVar1489;
  auVar695._8_8_ = 0;
  auVar695._0_8_ = uVar1484;
  auVar1275._8_8_ = 0;
  auVar1275._0_8_ = uVar1463;
  auVar696._8_8_ = 0;
  auVar696._0_8_ = uVar1464;
  auVar1276._8_8_ = 0;
  auVar1276._0_8_ = uVar1464;
  auVar6 = auVar696 * auVar1276 + auVar695 * auVar1275 + (auVar6 >> 0x34);
  auVar697._8_8_ = 0;
  auVar697._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar1453 = auVar694 * auVar1274 + auVar697 * ZEXT816(0x1000003d10) + auVar1453;
  uVar1482 = auVar1453._0_8_;
  auVar1421._8_8_ = 0;
  auVar1421._0_8_ = auVar1453._8_8_ * 0x1000 | uVar1482 >> 0x34;
  auVar698._8_8_ = 0;
  auVar698._0_8_ = uVar1484;
  auVar1277._8_8_ = 0;
  auVar1277._0_8_ = uVar1489;
  auVar699._8_8_ = 0;
  auVar699._0_8_ = uVar1486;
  auVar1278._8_8_ = 0;
  auVar1278._0_8_ = uVar1486;
  auVar700._8_8_ = 0;
  auVar700._0_8_ = uVar1464;
  auVar1279._8_8_ = 0;
  auVar1279._0_8_ = uVar1463;
  auVar6 = auVar700 * auVar1279 + (auVar6 >> 0x34);
  auVar701._8_8_ = 0;
  auVar701._0_8_ = auVar6._0_8_;
  auVar1421 = auVar701 * ZEXT816(0x1000003d10) + auVar699 * auVar1278 + auVar698 * auVar1277 +
              auVar1421;
  uVar1489 = auVar1421._0_8_;
  auVar1421 = auVar1421 >> 0x34;
  auVar1423._8_8_ = 0;
  auVar1423._0_8_ = auVar1421._0_8_;
  auVar702._8_8_ = 0;
  auVar702._0_8_ = auVar6._8_8_;
  auVar1422._8_8_ = auVar1421._8_8_;
  auVar1422._0_8_ = uVar1471 & 0xffffffffffffe;
  auVar1423 = auVar702 * ZEXT816(0x1000003d10000) + auVar1422 + auVar1423;
  uVar1463 = auVar1423._0_8_;
  uVar1464 = uVar1477 * 2 & 0x1ffffffffffffe;
  uVar1478 = uVar1463 & 0xfffffffffffff;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = uVar1478;
  auVar1280._8_8_ = 0;
  auVar1280._0_8_ = uVar1464;
  uVar1463 = (auVar1423._8_8_ << 0xc | uVar1463 >> 0x34) + (auVar1420._0_8_ & 0xffffffffffff);
  uVar1484 = uVar1482 * 2 & 0x1ffffffffffffe;
  uVar1486 = uVar1489 & 0xfffffffffffff;
  auVar704._8_8_ = 0;
  auVar704._0_8_ = uVar1486;
  auVar1281._8_8_ = 0;
  auVar1281._0_8_ = uVar1484;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = uVar1463;
  auVar1282._8_8_ = 0;
  auVar1282._0_8_ = uVar1463;
  auVar706._8_8_ = 0;
  auVar706._0_8_ = SUB168(auVar705 * auVar1282,0);
  auVar6 = auVar704 * auVar1281 + auVar703 * auVar1280 + auVar706 * ZEXT816(0x1000003d10);
  uVar1471 = auVar6._0_8_;
  auVar1424._8_8_ = 0;
  auVar1424._0_8_ = auVar6._8_8_ << 0xc | uVar1471 >> 0x34;
  uVar1463 = uVar1463 * 2;
  uVar1477 = uVar1477 & 0xfffffffffffff;
  auVar707._8_8_ = 0;
  auVar707._0_8_ = uVar1477;
  auVar1283._8_8_ = 0;
  auVar1283._0_8_ = uVar1463;
  auVar708._8_8_ = 0;
  auVar708._0_8_ = uVar1478;
  auVar1284._8_8_ = 0;
  auVar1284._0_8_ = uVar1484;
  auVar709._8_8_ = 0;
  auVar709._0_8_ = uVar1486;
  auVar1285._8_8_ = 0;
  auVar1285._0_8_ = uVar1486;
  auVar710._8_8_ = 0;
  auVar710._0_8_ = SUB168(auVar705 * auVar1282,8);
  auVar1424 = auVar710 * ZEXT816(0x1000003d10000) +
              auVar707 * auVar1283 + auVar709 * auVar1285 + auVar708 * auVar1284 + auVar1424;
  auVar711._8_8_ = 0;
  auVar711._0_8_ = uVar1477;
  auVar1286._8_8_ = 0;
  auVar1286._0_8_ = uVar1477;
  uVar1482 = uVar1482 & 0xfffffffffffff;
  auVar712._8_8_ = 0;
  auVar712._0_8_ = uVar1482;
  auVar1287._8_8_ = 0;
  auVar1287._0_8_ = uVar1463;
  auVar713._8_8_ = 0;
  auVar713._0_8_ = uVar1478;
  auVar1288._8_8_ = 0;
  auVar1288._0_8_ = uVar1489 * 2 & 0x1ffffffffffffe;
  auVar6 = auVar713 * auVar1288 + auVar712 * auVar1287 + (auVar1424 >> 0x34);
  auVar714._8_8_ = 0;
  auVar714._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1424._6_2_ & 0xf);
  auVar7 = auVar714 * ZEXT816(0x1000003d1) + auVar711 * auVar1286;
  uVar1489 = auVar7._0_8_;
  auVar1454._8_8_ = 0;
  auVar1454._0_8_ = auVar7._8_8_ << 0xc | uVar1489 >> 0x34;
  auVar715._8_8_ = 0;
  auVar715._0_8_ = uVar1482;
  auVar1289._8_8_ = 0;
  auVar1289._0_8_ = uVar1464;
  auVar716._8_8_ = 0;
  auVar716._0_8_ = uVar1486;
  auVar1290._8_8_ = 0;
  auVar1290._0_8_ = uVar1463;
  uVar1489 = uVar1489 & 0xfffffffffffff;
  auVar717._8_8_ = 0;
  auVar717._0_8_ = uVar1478;
  auVar1291._8_8_ = 0;
  auVar1291._0_8_ = uVar1478;
  auVar6 = auVar717 * auVar1291 + auVar716 * auVar1290 + (auVar6 >> 0x34);
  auVar718._8_8_ = 0;
  auVar718._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar1454 = auVar715 * auVar1289 + auVar718 * ZEXT816(0x1000003d10) + auVar1454;
  uVar1484 = auVar1454._0_8_;
  auVar1425._8_8_ = 0;
  auVar1425._0_8_ = auVar1454._8_8_ * 0x1000 | uVar1484 >> 0x34;
  auVar719._8_8_ = 0;
  auVar719._0_8_ = uVar1486;
  auVar1292._8_8_ = 0;
  auVar1292._0_8_ = uVar1464;
  uVar1484 = uVar1484 & 0xfffffffffffff;
  auVar720._8_8_ = 0;
  auVar720._0_8_ = uVar1482;
  auVar1293._8_8_ = 0;
  auVar1293._0_8_ = uVar1482;
  auVar721._8_8_ = 0;
  auVar721._0_8_ = uVar1478;
  auVar1294._8_8_ = 0;
  auVar1294._0_8_ = uVar1463;
  auVar6 = auVar721 * auVar1294 + (auVar6 >> 0x34);
  auVar722._8_8_ = 0;
  auVar722._0_8_ = auVar6._0_8_;
  auVar1425 = auVar722 * ZEXT816(0x1000003d10) + auVar720 * auVar1293 + auVar719 * auVar1292 +
              auVar1425;
  auVar7 = auVar1425 >> 0x34;
  auVar1427._8_8_ = 0;
  auVar1427._0_8_ = auVar7._0_8_;
  uVar1464 = auVar1425._0_8_ & 0xfffffffffffff;
  auVar723._8_8_ = 0;
  auVar723._0_8_ = auVar6._8_8_;
  auVar1426._8_8_ = auVar7._8_8_;
  auVar1426._0_8_ = uVar1471 & 0xffffffffffffe;
  auVar1427 = auVar723 * ZEXT816(0x1000003d10000) + auVar1426 + auVar1427;
  uVar1477 = auVar1427._0_8_;
  uVar1463 = (auVar1427._8_8_ << 0xc | uVar1477 >> 0x34) + (auVar1424._0_8_ & 0xffffffffffff);
  uVar1477 = uVar1477 & 0xfffffffffffff;
  uVar1471 = uVar1489 * 2;
  auVar724._8_8_ = 0;
  auVar724._0_8_ = uVar1477;
  auVar1295._8_8_ = 0;
  auVar1295._0_8_ = uVar1471;
  auVar725._8_8_ = 0;
  auVar725._0_8_ = uVar1464;
  auVar1296._8_8_ = 0;
  auVar1296._0_8_ = uVar1484 * 2;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = uVar1463;
  auVar1297._8_8_ = 0;
  auVar1297._0_8_ = uVar1463;
  auVar727._8_8_ = 0;
  auVar727._0_8_ = SUB168(auVar726 * auVar1297,0);
  auVar8 = auVar725 * auVar1296 + auVar724 * auVar1295 + auVar727 * ZEXT816(0x1000003d10);
  r->n[0] = uVar1489;
  r->n[1] = uVar1484;
  r->n[2] = uVar1464;
  r->n[3] = uVar1477;
  r->n[4] = uVar1463;
  uVar1463 = uVar1463 * 2;
  auVar728._8_8_ = 0;
  auVar728._0_8_ = uVar1489;
  auVar1298._8_8_ = 0;
  auVar1298._0_8_ = uVar1463;
  auVar729._8_8_ = 0;
  auVar729._0_8_ = uVar1477;
  auVar1299._8_8_ = 0;
  auVar1299._0_8_ = uVar1484 * 2;
  auVar730._8_8_ = 0;
  auVar730._0_8_ = uVar1464;
  auVar1300._8_8_ = 0;
  auVar1300._0_8_ = uVar1464;
  auVar731._8_8_ = 0;
  auVar731._0_8_ = SUB168(auVar726 * auVar1297,8);
  auVar6 = auVar731 * ZEXT816(0x1000003d10000) +
           auVar728 * auVar1298 + auVar730 * auVar1300 + auVar729 * auVar1299 + (auVar8 >> 0x34);
  auVar732._8_8_ = 0;
  auVar732._0_8_ = uVar1489;
  auVar1301._8_8_ = 0;
  auVar1301._0_8_ = uVar1489;
  auVar733._8_8_ = 0;
  auVar733._0_8_ = uVar1484;
  auVar1302._8_8_ = 0;
  auVar1302._0_8_ = uVar1463;
  auVar734._8_8_ = 0;
  auVar734._0_8_ = uVar1477;
  auVar1303._8_8_ = 0;
  auVar1303._0_8_ = uVar1464 * 2;
  auVar7 = auVar734 * auVar1303 + auVar733 * auVar1302 + (auVar6 >> 0x34);
  auVar735._8_8_ = 0;
  auVar735._0_8_ = (auVar7._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar9 = auVar735 * ZEXT816(0x1000003d1) + auVar732 * auVar1301;
  uVar1489 = auVar9._0_8_;
  auVar1455._8_8_ = 0;
  auVar1455._0_8_ = auVar9._8_8_ << 0xc | uVar1489 >> 0x34;
  auVar736._8_8_ = 0;
  auVar736._0_8_ = uVar1484;
  auVar1304._8_8_ = 0;
  auVar1304._0_8_ = uVar1471;
  auVar737._8_8_ = 0;
  auVar737._0_8_ = uVar1464;
  auVar1305._8_8_ = 0;
  auVar1305._0_8_ = uVar1463;
  auVar738._8_8_ = 0;
  auVar738._0_8_ = uVar1477;
  auVar1306._8_8_ = 0;
  auVar1306._0_8_ = uVar1477;
  auVar7 = auVar738 * auVar1306 + auVar737 * auVar1305 + (auVar7 >> 0x34);
  auVar739._8_8_ = 0;
  auVar739._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
  auVar1455 = auVar736 * auVar1304 + auVar739 * ZEXT816(0x1000003d10) + auVar1455;
  uVar1482 = auVar1455._0_8_;
  uVar1478 = auVar1455._8_8_;
  auVar1336._8_8_ = uVar1478 >> 0x34;
  auVar1336._0_8_ = uVar1478 * 0x1000 | uVar1482 >> 0x34;
  auVar740._8_8_ = 0;
  auVar740._0_8_ = uVar1464;
  auVar1307._8_8_ = 0;
  auVar1307._0_8_ = uVar1471;
  auVar741._8_8_ = 0;
  auVar741._0_8_ = uVar1484;
  auVar1308._8_8_ = 0;
  auVar1308._0_8_ = uVar1484;
  auVar742._8_8_ = 0;
  auVar742._0_8_ = uVar1477;
  auVar1309._8_8_ = 0;
  auVar1309._0_8_ = uVar1463;
  auVar7 = auVar742 * auVar1309 + (auVar7 >> 0x34);
  auVar743._8_8_ = 0;
  auVar743._0_8_ = auVar7._0_8_;
  auVar1336 = auVar743 * ZEXT816(0x1000003d10) + auVar741 * auVar1308 + auVar740 * auVar1307 +
              auVar1336;
  auVar9 = auVar1336 >> 0x34;
  auVar1428._8_8_ = auVar9._8_8_;
  auVar1428._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
  auVar1429._8_8_ = 0;
  auVar1429._0_8_ = auVar9._0_8_;
  auVar744._8_8_ = 0;
  auVar744._0_8_ = auVar7._8_8_;
  auVar1429 = auVar744 * ZEXT816(0x1000003d10000) + auVar1428 + auVar1429;
  uVar1463 = auVar1429._0_8_;
  local_58.n[0] = (uVar1 - (uVar1489 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
  local_58.n[1] = (uVar2 + 0x3ffffffffffffc) - (uVar1482 & 0xfffffffffffff);
  local_58.n[2] = (uVar4 + 0x3ffffffffffffc) - (auVar1336._0_8_ & 0xfffffffffffff);
  local_58.n[3] = (uVar3 + 0x3ffffffffffffc) - (uVar1463 & 0xfffffffffffff);
  local_58.n[4] =
       (uVar5 - ((auVar1429._8_8_ << 0xc | uVar1463 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff))) +
       0x3fffffffffffc;
  iVar1462 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
  return iVar1462;
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 32);
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}